

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86_fma::forward_int8_x86
          (ConvolutionDepthWise_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  int *piVar4;
  _func_int **pp_Var5;
  void *pvVar6;
  void *pvVar7;
  Layer *pLVar8;
  undefined4 uVar9;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined8 uVar17;
  undefined4 uVar18;
  undefined1 uVar19;
  undefined1 uVar21;
  undefined1 uVar23;
  undefined1 uVar25;
  undefined1 auVar26 [32];
  int iVar27;
  long lVar28;
  undefined1 uVar29;
  uint uVar30;
  int iVar31;
  undefined4 *puVar32;
  ulong uVar33;
  long lVar34;
  int iVar35;
  int iVar36;
  float *pfVar37;
  uint _elempack;
  ulong uVar38;
  ulong uVar39;
  uint uVar40;
  int iVar41;
  int iVar42;
  _func_int *p_Var43;
  float fVar44;
  int iVar45;
  Option *_elemsize;
  Option *opt_00;
  long lVar46;
  int iVar47;
  int iVar48;
  undefined1 (*pauVar49) [16];
  undefined1 (*pauVar50) [16];
  ulong uVar51;
  bool bVar52;
  undefined1 auVar53 [16];
  float fVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [64];
  float fVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [64];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [64];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  __m128 one;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [64];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  Option opt_q;
  float top_rescale;
  float scale_out;
  Mat m_1;
  Option opt_g;
  undefined1 local_308 [32];
  undefined1 local_2e8 [32];
  size_t local_2c8;
  float *local_2b8;
  ulong local_2b0;
  float *local_2a8;
  _func_int **local_2a0;
  ulong local_298;
  ulong local_290;
  Mat local_288;
  undefined1 local_238 [40];
  undefined1 auStack_210 [16];
  ulong uStack_200;
  size_t local_1f8;
  long local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  _func_int **local_1d0;
  undefined1 local_1c8 [56];
  int local_190;
  size_t local_188;
  undefined8 local_178;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  Allocator *local_168;
  int local_160;
  Allocator *local_158;
  undefined1 local_150 [16];
  undefined4 local_140;
  ulong local_138;
  void *local_128;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  Allocator *local_118;
  int local_110;
  Allocator *local_108;
  undefined1 local_100 [16];
  int local_f0;
  ulong local_e8;
  long local_e0;
  vector<float,_std::allocator<float>_> local_d8;
  vector<float,_std::allocator<float>_> local_c0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined4 uVar11;
  undefined3 uVar13;
  undefined2 uVar15;
  undefined4 uVar20;
  undefined3 uVar22;
  undefined2 uVar24;
  
  local_1c8._24_4_ = bottom_blob->elempack;
  local_190 = bottom_blob->c;
  if (local_1c8._24_4_ == 0) {
    bVar52 = false;
  }
  else {
    bVar52 = ((int)bottom_blob->elemsize << 3) / (int)local_1c8._24_4_ == 8;
  }
  p_Var43 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
  iVar36 = *(int *)(&this->field_0xd4 + (long)p_Var43);
  iVar47 = *(int *)(&this->field_0xd8 + (long)p_Var43);
  iVar41 = *(int *)(&this->field_0xdc + (long)p_Var43);
  iVar48 = *(int *)(&this->field_0xe0 + (long)p_Var43);
  piVar4 = bottom_blob->refcount;
  local_1c8._0_8_ = bottom_blob->data;
  local_1c8._8_4_ = SUB84(bottom_blob->refcount,0);
  local_1c8._12_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_1c8._16_8_ = bottom_blob->elemsize;
  local_1c8._32_8_ = bottom_blob->allocator;
  local_1c8._40_4_ = bottom_blob->dims;
  local_1c8._44_4_ = bottom_blob->w;
  local_1c8._48_4_ = bottom_blob->h;
  local_1c8._52_4_ = bottom_blob->d;
  local_188 = bottom_blob->cstep;
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + 1;
    UNLOCK();
  }
  if (!bVar52) {
    uVar38 = (long)(local_1c8._24_4_ * local_190) /
             (long)*(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3])
    ;
    local_288.cstep = 0;
    local_288.data = (undefined4 *)0x0;
    local_288.refcount._0_4_ = 0;
    local_288.refcount._4_4_ = 0;
    local_288.elemsize = 0;
    local_288.elempack = 0;
    local_288.allocator = (Allocator *)0x0;
    local_288.dims = 0;
    local_288.w = 0;
    local_288.h = 0;
    local_288.d = 0;
    local_288.c = 0;
    Mat::create(&local_288,local_1c8._24_4_ * local_190,4,(Allocator *)0x0);
    pp_Var5 = this->_vptr_ConvolutionDepthWise_x86_fma;
    p_Var43 = pp_Var5[-3];
    if (0 < *(int *)(&this->field_0x108 + (long)p_Var43)) {
      lVar34 = 0;
      puVar32 = (undefined4 *)local_288.data;
      do {
        if (0 < (int)uVar38) {
          uVar3 = *(undefined4 *)(*(long *)(&this->field_0x240 + (long)p_Var43) + lVar34 * 4);
          uVar39 = uVar38 & 0xffffffff;
          do {
            *puVar32 = uVar3;
            puVar32 = puVar32 + 1;
            uVar40 = (int)uVar39 - 1;
            uVar39 = (ulong)uVar40;
          } while (uVar40 != 0);
        }
        lVar34 = lVar34 + 1;
        p_Var43 = pp_Var5[-3];
      } while (lVar34 < *(int *)(&this->field_0x108 + (long)p_Var43));
    }
    local_308._0_8_ = *(undefined8 *)opt;
    local_308._16_8_ = opt->workspace_allocator;
    uVar9 = opt->openmp_blocktime;
    uVar10 = opt->use_winograd_convolution;
    uVar12 = opt->use_sgemm_convolution;
    uVar14 = opt->use_int8_inference;
    uVar16 = opt->use_vulkan_compute;
    uVar15 = CONCAT11(uVar16,uVar14);
    uVar13 = CONCAT21(uVar15,uVar12);
    uVar11 = CONCAT31(uVar13,uVar10);
    local_2e8[0] = opt->use_bf16_storage;
    local_2e8[1] = opt->use_fp16_packed;
    local_2e8[2] = opt->use_fp16_storage;
    local_2e8[3] = opt->use_fp16_arithmetic;
    local_2e8[4] = opt->use_int8_packed;
    local_2e8[5] = opt->use_int8_storage;
    local_2e8[6] = opt->use_int8_arithmetic;
    local_2e8[7] = opt->use_packing_layout;
    local_2e8[8] = opt->use_shader_pack8;
    local_2e8[9] = opt->use_subgroup_basic;
    local_2e8[10] = opt->use_subgroup_vote;
    local_2e8[0xb] = opt->use_subgroup_ballot;
    local_2e8[0xc] = opt->use_subgroup_shuffle;
    local_2e8[0xd] = opt->use_image_storage;
    local_2e8[0xe] = opt->use_tensor_storage;
    local_2e8[0xf] = opt->use_reserved_0;
    local_2e8._16_4_ = opt->flush_denormals;
    local_2e8[0x14] = opt->use_local_pool_allocator;
    local_2e8[0x15] = opt->use_shader_local_memory;
    local_2e8[0x16] = opt->use_cooperative_matrix;
    local_2e8[0x17] = opt->use_winograd23_convolution;
    local_2e8[0x18] = opt->use_winograd43_convolution;
    local_2e8[0x19] = opt->use_winograd63_convolution;
    local_2e8[0x1a] = opt->use_a53_a55_optimized_kernel;
    local_2e8[0x1b] = opt->use_reserved_7;
    local_2e8[0x1c] = opt->use_reserved_8;
    local_2e8[0x1d] = opt->use_reserved_9;
    local_2e8[0x1e] = opt->use_reserved_10;
    local_2e8[0x1f] = opt->use_reserved_11;
    local_308._8_4_ = SUB84(opt->workspace_allocator,0);
    local_308._12_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_308._24_4_ = uVar9;
    local_308._28_4_ = uVar11;
    quantize_to_int8(bottom_blob,(Mat *)local_1c8,&local_288,(Option *)local_308);
    piVar4 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_288.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_288.data != (undefined4 *)0x0) {
            free(local_288.data);
          }
        }
        else {
          (*(local_288.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  local_288.cstep = 0;
  local_288.data = (pointer)0x0;
  local_288.refcount._0_4_ = 0;
  local_288.refcount._4_4_ = 0;
  local_288.elemsize = 0;
  local_288.elempack = 0;
  local_288.allocator = (Allocator *)0x0;
  local_288.dims = 0;
  local_288.w = 0;
  local_288.h = 0;
  local_288.d = 0;
  local_288.c = 0;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86_fma +
             (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]),(Mat *)local_1c8,&local_288,opt);
  iVar31 = local_288.c;
  iVar27 = local_288.w;
  iVar35 = local_288.elempack;
  iVar42 = -100;
  local_308._8_8_ = (Allocator *)CONCAT44(local_308._12_4_,local_308._8_4_);
  if (((pointer)local_288.data == (pointer)0x0) ||
     (local_308._8_8_ = (Allocator *)CONCAT44(local_308._12_4_,local_308._8_4_),
     (long)local_288.c * local_288.cstep == 0)) goto LAB_0040d647;
  uVar39 = (ulong)(uint)local_288.c;
  p_Var43 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
  iVar36 = (~((iVar36 + -1) * iVar41) + local_288.w) / *(int *)(&this->field_0xe4 + (long)p_Var43);
  iVar41 = iVar36 + 1;
  uVar38 = (long)(~((iVar47 + -1) * iVar48) + local_288.h) /
           (long)*(int *)(&this->field_0xe8 + (long)p_Var43);
  local_1d8 = uVar38 & 0xffffffff;
  iVar47 = (int)uVar38 + 1;
  uVar40 = local_288.c * local_288.elempack;
  if ((uVar40 == *(uint *)(&this->field_0x108 + (long)p_Var43)) &&
     (uVar30 = *(uint *)(&this->field_0xd0 + (long)p_Var43),
     *(uint *)(&this->field_0x108 + (long)p_Var43) == uVar30)) {
    uVar40 = 8;
    if (opt->use_packing_layout == false) {
      uVar40 = 1;
    }
    if ((uVar30 & 7) != 0) {
      uVar40 = 1;
    }
    opt_00 = (Option *)(ulong)uVar40;
    iVar48 = *(int *)(&this->field_0x10c + (long)p_Var43);
    _elemsize = (Option *)(ulong)(uVar40 * 4);
    if (100 < iVar48) {
      _elemsize = opt_00;
    }
    Mat::create(top_blob,iVar41,iVar47,(int)uVar30 / (int)uVar40,(size_t)_elemsize,uVar40,
                opt->blob_allocator);
    iVar42 = -100;
    local_308._8_8_ = (Allocator *)CONCAT44(local_308._12_4_,local_308._8_4_);
    if ((top_blob->data == (void *)0x0) ||
       (local_308._8_8_ = (Allocator *)CONCAT44(local_308._12_4_,local_308._8_4_),
       (long)top_blob->c * top_blob->cstep == 0)) goto LAB_0040d647;
    iVar42 = 0;
    if (iVar35 != 1) {
      local_308._8_8_ = (Allocator *)CONCAT44(local_308._12_4_,local_308._8_4_);
      if (iVar35 == 8) {
        uVar38 = (long)*(int *)(&this->field_0xd8 +
                               (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]) *
                 (long)*(int *)(&this->field_0xd4 +
                               (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_308,uVar38,(allocator_type *)local_238
                  );
        pp_Var5 = this->_vptr_ConvolutionDepthWise_x86_fma;
        p_Var43 = pp_Var5[-3];
        if (0 < *(int *)(&this->field_0xd8 + (long)p_Var43)) {
          iVar47 = *(int *)(&this->field_0xe0 + (long)p_Var43);
          iVar41 = *(int *)(&this->field_0xdc + (long)p_Var43);
          iVar35 = *(int *)(&this->field_0xd4 + (long)p_Var43);
          iVar42 = 0;
          fVar44 = 0.0;
          iVar45 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var5[-3])) {
              lVar34 = 0;
              do {
                *(float *)(local_308._0_8_ + (iVar42 + lVar34) * 4) = fVar44;
                fVar44 = (float)((int)fVar44 + *(int *)(&this->field_0xdc + (long)pp_Var5[-3]));
                lVar34 = lVar34 + 1;
              } while ((int)lVar34 < *(int *)(&this->field_0xd4 + (long)pp_Var5[-3]));
              iVar42 = iVar42 + (int)lVar34;
            }
            fVar44 = (float)((int)fVar44 + (iVar47 * iVar27 - iVar41 * iVar35));
            iVar45 = iVar45 + 1;
          } while (iVar45 < *(int *)(&this->field_0xd8 + (long)pp_Var5[-3]));
        }
        local_1d0 = (_func_int **)CONCAT44(local_1d0._4_4_,iVar27);
        if (0 < iVar31) {
          iVar47 = (int)uVar38 * 8;
          local_1e8 = CONCAT44(local_1e8._4_4_,iVar47);
          local_290 = 0;
          auVar180 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
          auVar99 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
          auVar53._8_4_ = 0x3f800000;
          auVar53._0_8_ = 0x3f8000003f800000;
          auVar53._12_4_ = 0x3f800000;
          local_298 = 0;
          do {
            if (-1 < (int)local_1d8) {
              local_2a0 = (_func_int **)
                          (local_288.cstep * local_298 * local_288.elemsize + (long)local_288.data);
              pauVar49 = (undefined1 (*) [16])
                         (top_blob->elemsize * local_298 * top_blob->cstep + (long)top_blob->data);
              pp_Var5 = this->_vptr_ConvolutionDepthWise_x86_fma;
              local_2a8 = (float *)((long)local_288.w * local_288.elemsize);
              pvVar6 = (this->weight_data_tm).data;
              local_2b0 = 0;
              pauVar50 = pauVar49;
              do {
                if (-1 < iVar36) {
                  local_2b8 = (float *)(long)(int)local_2b0;
                  iVar41 = 0;
                  do {
                    p_Var43 = pp_Var5[-3];
                    if ((int)uVar38 < 1) {
                      auVar190 = ZEXT816(0) << 0x40;
                      auVar116 = ZEXT816(0) << 0x40;
                    }
                    else {
                      auVar107 = ZEXT1664((undefined1  [16])0x0);
                      uVar51 = 0;
                      auVar114 = ZEXT1664((undefined1  [16])0x0);
                      do {
                        auVar190._8_8_ = 0;
                        auVar190._0_8_ =
                             *(ulong *)((long)local_2a0 +
                                       (long)(int)*(pointer)(local_308._0_8_ + uVar51 * 4) * 8 +
                                       (long)*(int *)(&this->field_0xe8 + (long)p_Var43) *
                                       (long)local_2b8 * (long)local_2a8 +
                                       (long)(*(int *)(&this->field_0xe4 + (long)p_Var43) * iVar41 *
                                             8));
                        auVar116 = vpcmpgtb_avx((undefined1  [16])0x0,auVar190);
                        auVar190 = vpunpcklbw_avx(auVar190,auVar116);
                        auVar127._8_8_ = 0;
                        auVar127._0_8_ =
                             *(ulong *)((long)pvVar6 + uVar51 * 8 + (long)(int)local_290);
                        auVar116 = vpcmpgtb_avx((undefined1  [16])0x0,auVar127);
                        auVar116 = vpunpcklbw_avx(auVar127,auVar116);
                        auVar127 = vpmullw_avx(auVar116,auVar190);
                        auVar190 = vpmulhw_avx(auVar190,auVar116);
                        auVar116 = vpunpcklwd_avx(auVar127,auVar190);
                        auVar116 = vpaddd_avx(auVar107._0_16_,auVar116);
                        auVar107 = ZEXT1664(auVar116);
                        auVar190 = vpunpckhwd_avx(auVar127,auVar190);
                        auVar190 = vpaddd_avx(auVar114._0_16_,auVar190);
                        auVar114 = ZEXT1664(auVar190);
                        uVar51 = uVar51 + 1;
                      } while ((uVar38 & 0xffffffff) != uVar51);
                      auVar116 = vcvtdq2ps_avx(auVar116);
                      auVar190 = vcvtdq2ps_avx(auVar190);
                    }
                    auVar127 = *(undefined1 (*) [16])
                                (*(long *)(&this->field_0x1f8 + (long)p_Var43) + local_298 * 0x20);
                    auVar108 = *(undefined1 (*) [16])
                                (*(long *)(&this->field_0x1f8 + (long)p_Var43) + 0x10 +
                                local_298 * 0x20);
                    pfVar37 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var43) +
                                       local_298 * 0x20);
                    auVar186._0_4_ = auVar127._0_4_ * *pfVar37;
                    auVar186._4_4_ = auVar127._4_4_ * pfVar37[1];
                    auVar186._8_4_ = auVar127._8_4_ * pfVar37[2];
                    auVar186._12_4_ = auVar127._12_4_ * pfVar37[3];
                    auVar101 = vrcpps_avx(auVar186);
                    pfVar37 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var43) + 0x10 +
                                       local_298 * 0x20);
                    auVar198._0_4_ = auVar108._0_4_ * *pfVar37;
                    auVar198._4_4_ = auVar108._4_4_ * pfVar37[1];
                    auVar198._8_4_ = auVar108._8_4_ * pfVar37[2];
                    auVar198._12_4_ = auVar108._12_4_ * pfVar37[3];
                    auVar186 = vrcpps_avx(auVar198);
                    auVar127 = vcmpps_avx(auVar127,(undefined1  [16])0x0,4);
                    auVar127 = vandps_avx(auVar101,auVar127);
                    auVar101._0_4_ = auVar127._0_4_ * auVar116._0_4_;
                    auVar101._4_4_ = auVar127._4_4_ * auVar116._4_4_;
                    auVar101._8_4_ = auVar127._8_4_ * auVar116._8_4_;
                    auVar101._12_4_ = auVar127._12_4_ * auVar116._12_4_;
                    auVar116 = vcmpps_avx(auVar108,(undefined1  [16])0x0,4);
                    auVar116 = vandps_avx(auVar186,auVar116);
                    auVar108._0_4_ = auVar116._0_4_ * auVar190._0_4_;
                    auVar108._4_4_ = auVar116._4_4_ * auVar190._4_4_;
                    auVar108._8_4_ = auVar116._8_4_ * auVar190._8_4_;
                    auVar108._12_4_ = auVar116._12_4_ * auVar190._12_4_;
                    if (*(int *)(&this->field_0x100 + (long)p_Var43) != 0) {
                      pfVar37 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var43) +
                                         local_298 * 0x20);
                      auVar101._0_4_ = auVar101._0_4_ + *pfVar37;
                      auVar101._4_4_ = auVar101._4_4_ + pfVar37[1];
                      auVar101._8_4_ = auVar101._8_4_ + pfVar37[2];
                      auVar101._12_4_ = auVar101._12_4_ + pfVar37[3];
                      pfVar37 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var43) + 0x10 +
                                         local_298 * 0x20);
                      auVar108._0_4_ = auVar108._0_4_ + *pfVar37;
                      auVar108._4_4_ = auVar108._4_4_ + pfVar37[1];
                      auVar108._8_4_ = auVar108._8_4_ + pfVar37[2];
                      auVar108._12_4_ = auVar108._12_4_ + pfVar37[3];
                    }
                    iVar35 = *(int *)(&this->field_0x110 + (long)p_Var43) + -1;
                    auVar116 = auVar99._0_16_;
                    fVar44 = auVar101._4_4_;
                    fVar54 = auVar101._8_4_;
                    fVar1 = auVar101._12_4_;
                    switch(iVar35) {
                    case 0:
                      auVar101 = vmaxps_avx(auVar101,(undefined1  [16])0x0);
                      break;
                    case 1:
                      auVar116 = vmaxps_avx(auVar101,(undefined1  [16])0x0);
                      auVar190 = vminps_avx(auVar101,(undefined1  [16])0x0);
                      uVar3 = **(undefined4 **)(&this->field_0x118 + (long)p_Var43);
                      auVar104._4_4_ = uVar3;
                      auVar104._0_4_ = uVar3;
                      auVar104._8_4_ = uVar3;
                      auVar104._12_4_ = uVar3;
                      auVar101 = vfmadd213ps_fma(auVar104,auVar190,auVar116);
                      break;
                    case 2:
                      uVar3 = **(undefined4 **)(&this->field_0x118 + (long)p_Var43);
                      auVar118._4_4_ = uVar3;
                      auVar118._0_4_ = uVar3;
                      auVar118._8_4_ = uVar3;
                      auVar118._12_4_ = uVar3;
                      uVar3 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var43))[1];
                      auVar133._4_4_ = uVar3;
                      auVar133._0_4_ = uVar3;
                      auVar133._8_4_ = uVar3;
                      auVar133._12_4_ = uVar3;
                      auVar116 = vmaxps_avx(auVar101,auVar118);
                      auVar101 = vminps_avx(auVar116,auVar133);
                      break;
                    case 3:
                      auVar102._0_4_ = auVar180._0_4_ ^ (uint)auVar101._0_4_;
                      auVar102._4_4_ = auVar180._4_4_ ^ (uint)fVar44;
                      auVar102._8_4_ = auVar180._8_4_ ^ (uint)fVar54;
                      auVar102._12_4_ = auVar180._12_4_ ^ (uint)fVar1;
                      auVar75._8_4_ = 0x42b0c0a5;
                      auVar75._0_8_ = 0x42b0c0a542b0c0a5;
                      auVar75._12_4_ = 0x42b0c0a5;
                      auVar190 = vminps_avx(auVar102,auVar75);
                      auVar119._8_4_ = 0xc2b0c0a5;
                      auVar119._0_8_ = 0xc2b0c0a5c2b0c0a5;
                      auVar119._12_4_ = 0xc2b0c0a5;
                      auVar101 = vmaxps_avx(auVar190,auVar119);
                      auVar120._8_4_ = 0x3fb8aa3b;
                      auVar120._0_8_ = 0x3fb8aa3b3fb8aa3b;
                      auVar120._12_4_ = 0x3fb8aa3b;
                      auVar190 = vfmadd213ps_fma(auVar120,auVar101,auVar116);
                      auVar134._0_4_ = (int)auVar190._0_4_;
                      auVar134._4_4_ = (int)auVar190._4_4_;
                      auVar134._8_4_ = (int)auVar190._8_4_;
                      auVar134._12_4_ = (int)auVar190._12_4_;
                      auVar127 = vcvtdq2ps_avx(auVar134);
                      auVar190 = vcmpps_avx(auVar190,auVar127,1);
                      auVar190 = vandps_avx(auVar53,auVar190);
                      auVar190 = vsubps_avx(auVar127,auVar190);
                      auVar76._8_4_ = 0x3f318000;
                      auVar76._0_8_ = 0x3f3180003f318000;
                      auVar76._12_4_ = 0x3f318000;
                      auVar127 = vfmsub231ps_fma(auVar101,auVar190,auVar76);
                      auVar135._8_4_ = 0x395e8083;
                      auVar135._0_8_ = 0x395e8083395e8083;
                      auVar135._12_4_ = 0x395e8083;
                      auVar101 = vfmsub231ps_fma(auVar127,auVar190,auVar135);
                      auVar136._0_4_ = auVar101._0_4_ * auVar101._0_4_;
                      auVar136._4_4_ = auVar101._4_4_ * auVar101._4_4_;
                      auVar136._8_4_ = auVar101._8_4_ * auVar101._8_4_;
                      auVar136._12_4_ = auVar101._12_4_ * auVar101._12_4_;
                      auVar192._8_4_ = 0x39506967;
                      auVar192._0_8_ = 0x3950696739506967;
                      auVar192._12_4_ = 0x39506967;
                      auVar156._8_4_ = 0x3ab743ce;
                      auVar156._0_8_ = 0x3ab743ce3ab743ce;
                      auVar156._12_4_ = 0x3ab743ce;
                      auVar127 = vfmadd213ps_fma(auVar192,auVar101,auVar156);
                      auVar77._8_4_ = 0x3c088908;
                      auVar77._0_8_ = 0x3c0889083c088908;
                      auVar77._12_4_ = 0x3c088908;
                      auVar127 = vfmadd213ps_fma(auVar127,auVar101,auVar77);
                      auVar78._8_4_ = 0x3d2aa9c1;
                      auVar78._0_8_ = 0x3d2aa9c13d2aa9c1;
                      auVar78._12_4_ = 0x3d2aa9c1;
                      auVar127 = vfmadd213ps_fma(auVar127,auVar101,auVar78);
                      auVar79._8_4_ = 0x3e2aaaaa;
                      auVar79._0_8_ = 0x3e2aaaaa3e2aaaaa;
                      auVar79._12_4_ = 0x3e2aaaaa;
                      auVar127 = vfmadd213ps_fma(auVar127,auVar101,auVar79);
                      auVar116 = vfmadd213ps_fma(auVar127,auVar101,auVar116);
                      auVar116 = vfmadd213ps_fma(auVar116,auVar136,auVar101);
                      auVar137._0_4_ = auVar116._0_4_ + 1.0;
                      auVar137._4_4_ = auVar116._4_4_ + 1.0;
                      auVar137._8_4_ = auVar116._8_4_ + 1.0;
                      auVar137._12_4_ = auVar116._12_4_ + 1.0;
                      auVar103._0_4_ = (int)auVar190._0_4_;
                      auVar103._4_4_ = (int)auVar190._4_4_;
                      auVar103._8_4_ = (int)auVar190._8_4_;
                      auVar103._12_4_ = (int)auVar190._12_4_;
                      auVar116 = vpslld_avx(auVar103,0x17);
                      auVar116 = vpaddd_avx(auVar53,auVar116);
                      auVar190 = vfmadd213ps_fma(auVar116,auVar137,auVar53);
                      auVar116 = vrcpps_avx(auVar190);
                      auVar190 = vfmsub213ps_fma(auVar190,auVar116,auVar53);
                      auVar101 = vfnmadd132ps_fma(auVar190,auVar116,auVar116);
                      break;
                    case 4:
                      auVar55._8_4_ = 0x42b0c0a5;
                      auVar55._0_8_ = 0x42b0c0a542b0c0a5;
                      auVar55._12_4_ = 0x42b0c0a5;
                      auVar190 = vminps_avx(auVar101,auVar55);
                      auVar208._8_4_ = 0xc2b0c0a5;
                      auVar208._0_8_ = 0xc2b0c0a5c2b0c0a5;
                      auVar208._12_4_ = 0xc2b0c0a5;
                      auVar127 = vmaxps_avx(auVar208,auVar190);
                      auVar128._8_4_ = 0x3fb8aa3b;
                      auVar128._0_8_ = 0x3fb8aa3b3fb8aa3b;
                      auVar128._12_4_ = 0x3fb8aa3b;
                      auVar116 = vfmadd213ps_fma(auVar128,auVar127,auVar116);
                      auVar187._0_4_ = (int)auVar116._0_4_;
                      auVar187._4_4_ = (int)auVar116._4_4_;
                      auVar187._8_4_ = (int)auVar116._8_4_;
                      auVar187._12_4_ = (int)auVar116._12_4_;
                      auVar190 = vcvtdq2ps_avx(auVar187);
                      auVar116 = vcmpps_avx(auVar116,auVar190,1);
                      auVar116 = vandps_avx(auVar53,auVar116);
                      auVar116 = vsubps_avx(auVar190,auVar116);
                      auVar196._8_4_ = 0x3f318000;
                      auVar196._0_8_ = 0x3f3180003f318000;
                      auVar196._12_4_ = 0x3f318000;
                      auVar190 = vfmsub231ps_fma(auVar127,auVar116,auVar196);
                      auVar92._8_4_ = 0xb95e8083;
                      auVar92._0_8_ = 0xb95e8083b95e8083;
                      auVar92._12_4_ = 0xb95e8083;
                      auVar127 = vfnmsub231ps_fma(auVar190,auVar116,auVar92);
                      auVar188._0_4_ = auVar127._0_4_ * auVar127._0_4_;
                      auVar188._4_4_ = auVar127._4_4_ * auVar127._4_4_;
                      auVar188._8_4_ = auVar127._8_4_ * auVar127._8_4_;
                      auVar188._12_4_ = auVar127._12_4_ * auVar127._12_4_;
                      auVar166._8_4_ = 0x39506967;
                      auVar166._0_8_ = 0x3950696739506967;
                      auVar166._12_4_ = 0x39506967;
                      auVar181._8_4_ = 0x3ab743ce;
                      auVar181._0_8_ = 0x3ab743ce3ab743ce;
                      auVar181._12_4_ = 0x3ab743ce;
                      auVar190 = vfmadd213ps_fma(auVar166,auVar127,auVar181);
                      auVar182._8_4_ = 0x3c088908;
                      auVar182._0_8_ = 0x3c0889083c088908;
                      auVar182._12_4_ = 0x3c088908;
                      auVar190 = vfmadd213ps_fma(auVar190,auVar127,auVar182);
                      auVar149._8_4_ = 0x3d2aa9c1;
                      auVar149._0_8_ = 0x3d2aa9c13d2aa9c1;
                      auVar149._12_4_ = 0x3d2aa9c1;
                      auVar190 = vfmadd213ps_fma(auVar190,auVar127,auVar149);
                      auVar150._8_4_ = 0x3e2aaaaa;
                      auVar150._0_8_ = 0x3e2aaaaa3e2aaaaa;
                      auVar150._12_4_ = 0x3e2aaaaa;
                      auVar190 = vfmadd213ps_fma(auVar190,auVar127,auVar150);
                      auVar151._8_4_ = 0x3f000000;
                      auVar151._0_8_ = 0x3f0000003f000000;
                      auVar151._12_4_ = 0x3f000000;
                      auVar190 = vfmadd213ps_fma(auVar190,auVar127,auVar151);
                      auVar190 = vfmadd213ps_fma(auVar190,auVar188,auVar127);
                      auVar189._0_4_ = auVar190._0_4_ + 1.0;
                      auVar189._4_4_ = auVar190._4_4_ + 1.0;
                      auVar189._8_4_ = auVar190._8_4_ + 1.0;
                      auVar189._12_4_ = auVar190._12_4_ + 1.0;
                      auVar115._0_4_ = (int)auVar116._0_4_;
                      auVar115._4_4_ = (int)auVar116._4_4_;
                      auVar115._8_4_ = (int)auVar116._8_4_;
                      auVar115._12_4_ = (int)auVar116._12_4_;
                      auVar116 = vpslld_avx(auVar115,0x17);
                      auVar116 = vpaddd_avx(auVar53,auVar116);
                      auVar198 = vfmadd213ps_fma(auVar116,auVar189,auVar53);
                      auVar56._8_4_ = 0x800000;
                      auVar56._0_8_ = 0x80000000800000;
                      auVar56._12_4_ = 0x800000;
                      auVar116 = vmaxps_avx(auVar198,auVar56);
                      auVar190 = vpsrld_avx(auVar116,0x17);
                      auVar57._8_4_ = 0x807fffff;
                      auVar57._0_8_ = 0x807fffff807fffff;
                      auVar57._12_4_ = 0x807fffff;
                      auVar116 = vandps_avx(auVar116,auVar57);
                      auVar58._8_4_ = 0x3f000000;
                      auVar58._0_8_ = 0x3f0000003f000000;
                      auVar58._12_4_ = 0x3f000000;
                      auVar186 = vorps_avx(auVar116,auVar58);
                      auVar59._8_4_ = 0xffffff82;
                      auVar59._0_8_ = 0xffffff82ffffff82;
                      auVar59._12_4_ = 0xffffff82;
                      auVar116 = vpaddd_avx(auVar190,auVar59);
                      auVar127 = vcvtdq2ps_avx(auVar116);
                      auVar60._8_4_ = 0x3f3504f3;
                      auVar60._0_8_ = 0x3f3504f33f3504f3;
                      auVar60._12_4_ = 0x3f3504f3;
                      auVar190 = vcmpps_avx(auVar186,auVar60,1);
                      auVar116 = vandps_avx(auVar190,auVar186);
                      auVar129._0_4_ = auVar186._0_4_ + -1.0 + auVar116._0_4_;
                      auVar129._4_4_ = auVar186._4_4_ + -1.0 + auVar116._4_4_;
                      auVar129._8_4_ = auVar186._8_4_ + -1.0 + auVar116._8_4_;
                      auVar129._12_4_ = auVar186._12_4_ + -1.0 + auVar116._12_4_;
                      auVar116 = vandps_avx(auVar190,auVar53);
                      auVar190 = vsubps_avx(auVar127,auVar116);
                      auVar191._0_4_ = auVar129._0_4_ * auVar129._0_4_;
                      auVar191._4_4_ = auVar129._4_4_ * auVar129._4_4_;
                      auVar191._8_4_ = auVar129._8_4_ * auVar129._8_4_;
                      auVar191._12_4_ = auVar129._12_4_ * auVar129._12_4_;
                      auVar199._8_4_ = 0x3d9021bb;
                      auVar199._0_8_ = 0x3d9021bb3d9021bb;
                      auVar199._12_4_ = 0x3d9021bb;
                      auVar61._8_4_ = 0xbdebd1b8;
                      auVar61._0_8_ = 0xbdebd1b8bdebd1b8;
                      auVar61._12_4_ = 0xbdebd1b8;
                      auVar116 = vfmadd213ps_fma(auVar199,auVar129,auVar61);
                      auVar62._8_4_ = 0x3def251a;
                      auVar62._0_8_ = 0x3def251a3def251a;
                      auVar62._12_4_ = 0x3def251a;
                      auVar116 = vfmadd213ps_fma(auVar116,auVar129,auVar62);
                      auVar63._8_4_ = 0xbdfe5d4f;
                      auVar63._0_8_ = 0xbdfe5d4fbdfe5d4f;
                      auVar63._12_4_ = 0xbdfe5d4f;
                      auVar116 = vfmadd213ps_fma(auVar116,auVar129,auVar63);
                      auVar64._8_4_ = 0x3e11e9bf;
                      auVar64._0_8_ = 0x3e11e9bf3e11e9bf;
                      auVar64._12_4_ = 0x3e11e9bf;
                      auVar116 = vfmadd213ps_fma(auVar116,auVar129,auVar64);
                      auVar65._8_4_ = 0xbe2aae50;
                      auVar65._0_8_ = 0xbe2aae50be2aae50;
                      auVar65._12_4_ = 0xbe2aae50;
                      auVar116 = vfmadd213ps_fma(auVar116,auVar129,auVar65);
                      auVar66._8_4_ = 0x3e4cceac;
                      auVar66._0_8_ = 0x3e4cceac3e4cceac;
                      auVar66._12_4_ = 0x3e4cceac;
                      auVar116 = vfmadd213ps_fma(auVar116,auVar129,auVar66);
                      auVar67._8_4_ = 0xbe7ffffc;
                      auVar67._0_8_ = 0xbe7ffffcbe7ffffc;
                      auVar67._12_4_ = 0xbe7ffffc;
                      auVar116 = vfmadd213ps_fma(auVar116,auVar129,auVar67);
                      auVar68._8_4_ = 0x3eaaaaaa;
                      auVar68._0_8_ = 0x3eaaaaaa3eaaaaaa;
                      auVar68._12_4_ = 0x3eaaaaaa;
                      auVar116 = vfmadd213ps_fma(auVar116,auVar129,auVar68);
                      auVar200._0_4_ = auVar191._0_4_ * auVar129._0_4_ * auVar116._0_4_;
                      auVar200._4_4_ = auVar191._4_4_ * auVar129._4_4_ * auVar116._4_4_;
                      auVar200._8_4_ = auVar191._8_4_ * auVar129._8_4_ * auVar116._8_4_;
                      auVar200._12_4_ = auVar191._12_4_ * auVar129._12_4_ * auVar116._12_4_;
                      auVar69._8_4_ = 0x42b0c0a5;
                      auVar69._0_8_ = 0x42b0c0a542b0c0a5;
                      auVar69._12_4_ = 0x42b0c0a5;
                      auVar116 = vfmadd231ps_fma(auVar200,auVar190,auVar92);
                      auVar206._8_4_ = 0x3f000000;
                      auVar206._0_8_ = 0x3f0000003f000000;
                      auVar206._12_4_ = 0x3f000000;
                      auVar127 = vfmsub231ps_fma(auVar116,auVar206,auVar191);
                      auVar116 = vcmpps_avx(auVar198,(undefined1  [16])0x0,2);
                      auVar127 = vsubps_avx(auVar127,auVar129);
                      auVar190 = vfnmadd231ps_fma(auVar127,auVar196,auVar190);
                      auVar130._0_4_ = auVar190._0_4_ + auVar190._0_4_;
                      auVar130._4_4_ = auVar190._4_4_ + auVar190._4_4_;
                      auVar130._8_4_ = auVar190._8_4_ + auVar190._8_4_;
                      auVar130._12_4_ = auVar190._12_4_ + auVar190._12_4_;
                      auVar152._8_4_ = 0x7fffffff;
                      auVar152._0_8_ = 0x7fffffff7fffffff;
                      auVar152._12_4_ = 0x7fffffff;
                      auVar116 = vblendvps_avx(auVar130,auVar152,auVar116);
                      auVar116 = vminps_avx(auVar116,auVar69);
                      auVar127 = vmaxps_avx(auVar208,auVar116);
                      auVar131._8_4_ = 0x3fb8aa3b;
                      auVar131._0_8_ = 0x3fb8aa3b3fb8aa3b;
                      auVar131._12_4_ = 0x3fb8aa3b;
                      auVar70._8_4_ = 0x3f000000;
                      auVar70._0_8_ = 0x3f0000003f000000;
                      auVar70._12_4_ = 0x3f000000;
                      auVar116 = vfmadd213ps_fma(auVar131,auVar127,auVar70);
                      auVar153._0_4_ = (int)auVar116._0_4_;
                      auVar153._4_4_ = (int)auVar116._4_4_;
                      auVar153._8_4_ = (int)auVar116._8_4_;
                      auVar153._12_4_ = (int)auVar116._12_4_;
                      auVar190 = vcvtdq2ps_avx(auVar153);
                      auVar116 = vcmpps_avx(auVar116,auVar190,1);
                      auVar116 = vandps_avx(auVar53,auVar116);
                      auVar116 = vsubps_avx(auVar190,auVar116);
                      auVar190 = vfmsub231ps_fma(auVar127,auVar116,auVar196);
                      auVar127 = vfnmsub231ps_fma(auVar190,auVar116,auVar92);
                      auVar93._8_4_ = 0x3f000000;
                      auVar93._0_8_ = 0x3f0000003f000000;
                      auVar93._12_4_ = 0x3f000000;
                      auVar99 = ZEXT1664(auVar93);
                      auVar154._0_4_ = auVar127._0_4_ * auVar127._0_4_;
                      auVar154._4_4_ = auVar127._4_4_ * auVar127._4_4_;
                      auVar154._8_4_ = auVar127._8_4_ * auVar127._8_4_;
                      auVar154._12_4_ = auVar127._12_4_ * auVar127._12_4_;
                      auVar180 = ZEXT1664(CONCAT412(0x80000000,
                                                    CONCAT48(0x80000000,0x8000000080000000)));
                      auVar71._8_4_ = 0x3ab743ce;
                      auVar71._0_8_ = 0x3ab743ce3ab743ce;
                      auVar71._12_4_ = 0x3ab743ce;
                      auVar190 = vfmadd213ps_fma(auVar166,auVar127,auVar71);
                      auVar190 = vfmadd213ps_fma(auVar190,auVar127,auVar182);
                      auVar72._8_4_ = 0x3d2aa9c1;
                      auVar72._0_8_ = 0x3d2aa9c13d2aa9c1;
                      auVar72._12_4_ = 0x3d2aa9c1;
                      auVar190 = vfmadd213ps_fma(auVar190,auVar127,auVar72);
                      auVar73._8_4_ = 0x3e2aaaaa;
                      auVar73._0_8_ = 0x3e2aaaaa3e2aaaaa;
                      auVar73._12_4_ = 0x3e2aaaaa;
                      auVar190 = vfmadd213ps_fma(auVar190,auVar127,auVar73);
                      auVar190 = vfmadd213ps_fma(auVar190,auVar127,auVar93);
                      auVar190 = vfmadd213ps_fma(auVar190,auVar154,auVar127);
                      auVar117._0_4_ = auVar190._0_4_ + 1.0;
                      auVar117._4_4_ = auVar190._4_4_ + 1.0;
                      auVar117._8_4_ = auVar190._8_4_ + 1.0;
                      auVar117._12_4_ = auVar190._12_4_ + 1.0;
                      auVar132._0_4_ = (int)auVar116._0_4_;
                      auVar132._4_4_ = (int)auVar116._4_4_;
                      auVar132._8_4_ = (int)auVar116._8_4_;
                      auVar132._12_4_ = (int)auVar116._12_4_;
                      auVar116 = vpslld_avx(auVar132,0x17);
                      auVar116 = vpaddd_avx(auVar53,auVar116);
                      auVar190 = vfmadd213ps_fma(auVar116,auVar117,auVar53);
                      auVar116 = vrcpps_avx(auVar190);
                      auVar155._0_4_ = auVar116._0_4_ + auVar116._0_4_;
                      auVar155._4_4_ = auVar116._4_4_ + auVar116._4_4_;
                      auVar155._8_4_ = auVar116._8_4_ + auVar116._8_4_;
                      auVar155._12_4_ = auVar116._12_4_ + auVar116._12_4_;
                      auVar74._8_4_ = 0x40000000;
                      auVar74._0_8_ = 0x4000000040000000;
                      auVar74._12_4_ = 0x40000000;
                      auVar190 = vfmsub213ps_fma(auVar190,auVar155,auVar74);
                      auVar116 = vfnmadd213ps_fma(auVar190,auVar116,auVar155);
                      auVar101 = vfmsub231ps_fma(auVar101,auVar101,auVar116);
                      break;
                    case 5:
                      uVar3 = **(undefined4 **)(&this->field_0x118 + (long)p_Var43);
                      auVar116._4_4_ = uVar3;
                      auVar116._0_4_ = uVar3;
                      auVar116._8_4_ = uVar3;
                      auVar116._12_4_ = uVar3;
                      uVar3 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var43))[1];
                      auVar138._4_4_ = uVar3;
                      auVar138._0_4_ = uVar3;
                      auVar138._8_4_ = uVar3;
                      auVar138._12_4_ = uVar3;
                      auVar116 = vfmadd231ps_fma(auVar138,auVar101,auVar116);
                      auVar116 = vmaxps_avx(auVar116,(undefined1  [16])0x0);
                      auVar116 = vminps_avx(auVar53,auVar116);
                      auVar101._0_4_ = auVar116._0_4_ * auVar101._0_4_;
                      auVar101._4_4_ = auVar116._4_4_ * fVar44;
                      auVar101._8_4_ = auVar116._8_4_ * fVar54;
                      auVar101._12_4_ = auVar116._12_4_ * fVar1;
                    }
                    auVar116 = auVar99._0_16_;
                    fVar44 = auVar108._4_4_;
                    fVar54 = auVar108._8_4_;
                    fVar1 = auVar108._12_4_;
                    switch(iVar35) {
                    case 0:
                      auVar108 = vmaxps_avx(auVar108,(undefined1  [16])0x0);
                      break;
                    case 1:
                      auVar116 = vmaxps_avx(auVar108,(undefined1  [16])0x0);
                      auVar190 = vminps_avx(auVar108,(undefined1  [16])0x0);
                      uVar3 = **(undefined4 **)(&this->field_0x118 + (long)p_Var43);
                      auVar111._4_4_ = uVar3;
                      auVar111._0_4_ = uVar3;
                      auVar111._8_4_ = uVar3;
                      auVar111._12_4_ = uVar3;
                      auVar108 = vfmadd213ps_fma(auVar111,auVar190,auVar116);
                      break;
                    case 2:
                      uVar3 = **(undefined4 **)(&this->field_0x118 + (long)p_Var43);
                      auVar123._4_4_ = uVar3;
                      auVar123._0_4_ = uVar3;
                      auVar123._8_4_ = uVar3;
                      auVar123._12_4_ = uVar3;
                      uVar3 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var43))[1];
                      auVar143._4_4_ = uVar3;
                      auVar143._0_4_ = uVar3;
                      auVar143._8_4_ = uVar3;
                      auVar143._12_4_ = uVar3;
                      auVar116 = vmaxps_avx(auVar108,auVar123);
                      auVar108 = vminps_avx(auVar116,auVar143);
                      break;
                    case 3:
                      auVar109._0_4_ = auVar180._0_4_ ^ (uint)auVar108._0_4_;
                      auVar109._4_4_ = auVar180._4_4_ ^ (uint)fVar44;
                      auVar109._8_4_ = auVar180._8_4_ ^ (uint)fVar54;
                      auVar109._12_4_ = auVar180._12_4_ ^ (uint)fVar1;
                      auVar86._8_4_ = 0x42b0c0a5;
                      auVar86._0_8_ = 0x42b0c0a542b0c0a5;
                      auVar86._12_4_ = 0x42b0c0a5;
                      auVar190 = vminps_avx(auVar109,auVar86);
                      auVar124._8_4_ = 0xc2b0c0a5;
                      auVar124._0_8_ = 0xc2b0c0a5c2b0c0a5;
                      auVar124._12_4_ = 0xc2b0c0a5;
                      auVar108 = vmaxps_avx(auVar190,auVar124);
                      auVar125._8_4_ = 0x3fb8aa3b;
                      auVar125._0_8_ = 0x3fb8aa3b3fb8aa3b;
                      auVar125._12_4_ = 0x3fb8aa3b;
                      auVar190 = vfmadd213ps_fma(auVar125,auVar108,auVar116);
                      auVar144._0_4_ = (int)auVar190._0_4_;
                      auVar144._4_4_ = (int)auVar190._4_4_;
                      auVar144._8_4_ = (int)auVar190._8_4_;
                      auVar144._12_4_ = (int)auVar190._12_4_;
                      auVar127 = vcvtdq2ps_avx(auVar144);
                      auVar190 = vcmpps_avx(auVar190,auVar127,1);
                      auVar190 = vandps_avx(auVar53,auVar190);
                      auVar190 = vsubps_avx(auVar127,auVar190);
                      auVar87._8_4_ = 0x3f318000;
                      auVar87._0_8_ = 0x3f3180003f318000;
                      auVar87._12_4_ = 0x3f318000;
                      auVar127 = vfmsub231ps_fma(auVar108,auVar190,auVar87);
                      auVar145._8_4_ = 0x395e8083;
                      auVar145._0_8_ = 0x395e8083395e8083;
                      auVar145._12_4_ = 0x395e8083;
                      auVar108 = vfmsub231ps_fma(auVar127,auVar190,auVar145);
                      auVar146._0_4_ = auVar108._0_4_ * auVar108._0_4_;
                      auVar146._4_4_ = auVar108._4_4_ * auVar108._4_4_;
                      auVar146._8_4_ = auVar108._8_4_ * auVar108._8_4_;
                      auVar146._12_4_ = auVar108._12_4_ * auVar108._12_4_;
                      auVar165._8_4_ = 0x39506967;
                      auVar165._0_8_ = 0x3950696739506967;
                      auVar165._12_4_ = 0x39506967;
                      auVar185._8_4_ = 0x3ab743ce;
                      auVar185._0_8_ = 0x3ab743ce3ab743ce;
                      auVar185._12_4_ = 0x3ab743ce;
                      auVar127 = vfmadd213ps_fma(auVar165,auVar108,auVar185);
                      auVar88._8_4_ = 0x3c088908;
                      auVar88._0_8_ = 0x3c0889083c088908;
                      auVar88._12_4_ = 0x3c088908;
                      auVar127 = vfmadd213ps_fma(auVar127,auVar108,auVar88);
                      auVar89._8_4_ = 0x3d2aa9c1;
                      auVar89._0_8_ = 0x3d2aa9c13d2aa9c1;
                      auVar89._12_4_ = 0x3d2aa9c1;
                      auVar127 = vfmadd213ps_fma(auVar127,auVar108,auVar89);
                      auVar90._8_4_ = 0x3e2aaaaa;
                      auVar90._0_8_ = 0x3e2aaaaa3e2aaaaa;
                      auVar90._12_4_ = 0x3e2aaaaa;
                      auVar127 = vfmadd213ps_fma(auVar127,auVar108,auVar90);
                      auVar116 = vfmadd213ps_fma(auVar127,auVar108,auVar116);
                      auVar116 = vfmadd213ps_fma(auVar116,auVar146,auVar108);
                      auVar147._0_4_ = auVar116._0_4_ + 1.0;
                      auVar147._4_4_ = auVar116._4_4_ + 1.0;
                      auVar147._8_4_ = auVar116._8_4_ + 1.0;
                      auVar147._12_4_ = auVar116._12_4_ + 1.0;
                      auVar110._0_4_ = (int)auVar190._0_4_;
                      auVar110._4_4_ = (int)auVar190._4_4_;
                      auVar110._8_4_ = (int)auVar190._8_4_;
                      auVar110._12_4_ = (int)auVar190._12_4_;
                      auVar116 = vpslld_avx(auVar110,0x17);
                      auVar116 = vpaddd_avx(auVar53,auVar116);
                      auVar190 = vfmadd213ps_fma(auVar116,auVar147,auVar53);
                      auVar116 = vrcpps_avx(auVar190);
                      auVar190 = vfmsub213ps_fma(auVar190,auVar116,auVar53);
                      auVar108 = vfnmadd132ps_fma(auVar190,auVar116,auVar116);
                      break;
                    case 4:
                      auVar80._8_4_ = 0x42b0c0a5;
                      auVar80._0_8_ = 0x42b0c0a542b0c0a5;
                      auVar80._12_4_ = 0x42b0c0a5;
                      auVar190 = vminps_avx(auVar108,auVar80);
                      auVar209._8_4_ = 0xc2b0c0a5;
                      auVar209._0_8_ = 0xc2b0c0a5c2b0c0a5;
                      auVar209._12_4_ = 0xc2b0c0a5;
                      auVar127 = vmaxps_avx(auVar209,auVar190);
                      auVar197._8_4_ = 0x3fb8aa3b;
                      auVar197._0_8_ = 0x3fb8aa3b3fb8aa3b;
                      auVar197._12_4_ = 0x3fb8aa3b;
                      auVar116 = vfmadd213ps_fma(auVar197,auVar127,auVar116);
                      auVar157._0_4_ = (int)auVar116._0_4_;
                      auVar157._4_4_ = (int)auVar116._4_4_;
                      auVar157._8_4_ = (int)auVar116._8_4_;
                      auVar157._12_4_ = (int)auVar116._12_4_;
                      auVar190 = vcvtdq2ps_avx(auVar157);
                      auVar116 = vcmpps_avx(auVar116,auVar190,1);
                      auVar116 = vandps_avx(auVar53,auVar116);
                      auVar116 = vsubps_avx(auVar190,auVar116);
                      auVar81._8_4_ = 0x3f318000;
                      auVar81._0_8_ = 0x3f3180003f318000;
                      auVar81._12_4_ = 0x3f318000;
                      auVar190 = vfmsub231ps_fma(auVar127,auVar116,auVar81);
                      auVar94._8_4_ = 0xb95e8083;
                      auVar94._0_8_ = 0xb95e8083b95e8083;
                      auVar94._12_4_ = 0xb95e8083;
                      auVar127 = vfnmsub231ps_fma(auVar190,auVar116,auVar94);
                      auVar158._0_4_ = auVar127._0_4_ * auVar127._0_4_;
                      auVar158._4_4_ = auVar127._4_4_ * auVar127._4_4_;
                      auVar158._8_4_ = auVar127._8_4_ * auVar127._8_4_;
                      auVar158._12_4_ = auVar127._12_4_ * auVar127._12_4_;
                      auVar193._8_4_ = 0x39506967;
                      auVar193._0_8_ = 0x3950696739506967;
                      auVar193._12_4_ = 0x39506967;
                      auVar183._8_4_ = 0x3ab743ce;
                      auVar183._0_8_ = 0x3ab743ce3ab743ce;
                      auVar183._12_4_ = 0x3ab743ce;
                      auVar190 = vfmadd213ps_fma(auVar193,auVar127,auVar183);
                      auVar184._8_4_ = 0x3c088908;
                      auVar184._0_8_ = 0x3c0889083c088908;
                      auVar184._12_4_ = 0x3c088908;
                      auVar190 = vfmadd213ps_fma(auVar190,auVar127,auVar184);
                      auVar201._8_4_ = 0x3d2aa9c1;
                      auVar201._0_8_ = 0x3d2aa9c13d2aa9c1;
                      auVar201._12_4_ = 0x3d2aa9c1;
                      auVar190 = vfmadd213ps_fma(auVar190,auVar127,auVar201);
                      auVar202._8_4_ = 0x3e2aaaaa;
                      auVar202._0_8_ = 0x3e2aaaaa3e2aaaaa;
                      auVar202._12_4_ = 0x3e2aaaaa;
                      auVar190 = vfmadd213ps_fma(auVar190,auVar127,auVar202);
                      auVar203._8_4_ = 0x3f000000;
                      auVar203._0_8_ = 0x3f0000003f000000;
                      auVar203._12_4_ = 0x3f000000;
                      auVar190 = vfmadd213ps_fma(auVar190,auVar127,auVar203);
                      auVar190 = vfmadd213ps_fma(auVar190,auVar158,auVar127);
                      auVar159._0_4_ = auVar190._0_4_ + 1.0;
                      auVar159._4_4_ = auVar190._4_4_ + 1.0;
                      auVar159._8_4_ = auVar190._8_4_ + 1.0;
                      auVar159._12_4_ = auVar190._12_4_ + 1.0;
                      auVar121._0_4_ = (int)auVar116._0_4_;
                      auVar121._4_4_ = (int)auVar116._4_4_;
                      auVar121._8_4_ = (int)auVar116._8_4_;
                      auVar121._12_4_ = (int)auVar116._12_4_;
                      auVar116 = vpslld_avx(auVar121,0x17);
                      auVar116 = vpaddd_avx(auVar53,auVar116);
                      auVar198 = vfmadd213ps_fma(auVar116,auVar159,auVar53);
                      auVar139._8_4_ = 0x800000;
                      auVar139._0_8_ = 0x80000000800000;
                      auVar139._12_4_ = 0x800000;
                      auVar116 = vmaxps_avx(auVar198,auVar139);
                      auVar190 = vpsrld_avx(auVar116,0x17);
                      auVar167._8_4_ = 0x807fffff;
                      auVar167._0_8_ = 0x807fffff807fffff;
                      auVar167._12_4_ = 0x807fffff;
                      auVar116 = vandps_avx(auVar167,auVar116);
                      auVar168._8_4_ = 0x3f000000;
                      auVar168._0_8_ = 0x3f0000003f000000;
                      auVar168._12_4_ = 0x3f000000;
                      auVar186 = vorps_avx(auVar168,auVar116);
                      auVar169._8_4_ = 0xffffff82;
                      auVar169._0_8_ = 0xffffff82ffffff82;
                      auVar169._12_4_ = 0xffffff82;
                      auVar116 = vpaddd_avx(auVar169,auVar190);
                      auVar127 = vcvtdq2ps_avx(auVar116);
                      auVar170._8_4_ = 0x3f3504f3;
                      auVar170._0_8_ = 0x3f3504f33f3504f3;
                      auVar170._12_4_ = 0x3f3504f3;
                      auVar190 = vcmpps_avx(auVar186,auVar170,1);
                      auVar116 = vandps_avx(auVar190,auVar186);
                      auVar140._0_4_ = auVar116._0_4_ + auVar186._0_4_ + -1.0;
                      auVar140._4_4_ = auVar116._4_4_ + auVar186._4_4_ + -1.0;
                      auVar140._8_4_ = auVar116._8_4_ + auVar186._8_4_ + -1.0;
                      auVar140._12_4_ = auVar116._12_4_ + auVar186._12_4_ + -1.0;
                      auVar116 = vandps_avx(auVar190,auVar53);
                      auVar190 = vsubps_avx(auVar127,auVar116);
                      auVar194._0_4_ = auVar140._0_4_ * auVar140._0_4_;
                      auVar194._4_4_ = auVar140._4_4_ * auVar140._4_4_;
                      auVar194._8_4_ = auVar140._8_4_ * auVar140._8_4_;
                      auVar194._12_4_ = auVar140._12_4_ * auVar140._12_4_;
                      auVar204._8_4_ = 0x3d9021bb;
                      auVar204._0_8_ = 0x3d9021bb3d9021bb;
                      auVar204._12_4_ = 0x3d9021bb;
                      auVar171._8_4_ = 0xbdebd1b8;
                      auVar171._0_8_ = 0xbdebd1b8bdebd1b8;
                      auVar171._12_4_ = 0xbdebd1b8;
                      auVar116 = vfmadd213ps_fma(auVar204,auVar140,auVar171);
                      auVar172._8_4_ = 0x3def251a;
                      auVar172._0_8_ = 0x3def251a3def251a;
                      auVar172._12_4_ = 0x3def251a;
                      auVar116 = vfmadd213ps_fma(auVar116,auVar140,auVar172);
                      auVar173._8_4_ = 0xbdfe5d4f;
                      auVar173._0_8_ = 0xbdfe5d4fbdfe5d4f;
                      auVar173._12_4_ = 0xbdfe5d4f;
                      auVar116 = vfmadd213ps_fma(auVar116,auVar140,auVar173);
                      auVar174._8_4_ = 0x3e11e9bf;
                      auVar174._0_8_ = 0x3e11e9bf3e11e9bf;
                      auVar174._12_4_ = 0x3e11e9bf;
                      auVar116 = vfmadd213ps_fma(auVar116,auVar140,auVar174);
                      auVar175._8_4_ = 0xbe2aae50;
                      auVar175._0_8_ = 0xbe2aae50be2aae50;
                      auVar175._12_4_ = 0xbe2aae50;
                      auVar116 = vfmadd213ps_fma(auVar116,auVar140,auVar175);
                      auVar176._8_4_ = 0x3e4cceac;
                      auVar176._0_8_ = 0x3e4cceac3e4cceac;
                      auVar176._12_4_ = 0x3e4cceac;
                      auVar116 = vfmadd213ps_fma(auVar116,auVar140,auVar176);
                      auVar177._8_4_ = 0xbe7ffffc;
                      auVar177._0_8_ = 0xbe7ffffcbe7ffffc;
                      auVar177._12_4_ = 0xbe7ffffc;
                      auVar116 = vfmadd213ps_fma(auVar116,auVar140,auVar177);
                      auVar178._8_4_ = 0x3eaaaaaa;
                      auVar178._0_8_ = 0x3eaaaaaa3eaaaaaa;
                      auVar178._12_4_ = 0x3eaaaaaa;
                      auVar116 = vfmadd213ps_fma(auVar116,auVar140,auVar178);
                      auVar205._0_4_ = auVar194._0_4_ * auVar140._0_4_ * auVar116._0_4_;
                      auVar205._4_4_ = auVar194._4_4_ * auVar140._4_4_ * auVar116._4_4_;
                      auVar205._8_4_ = auVar194._8_4_ * auVar140._8_4_ * auVar116._8_4_;
                      auVar205._12_4_ = auVar194._12_4_ * auVar140._12_4_ * auVar116._12_4_;
                      auVar207._8_4_ = 0x42b0c0a5;
                      auVar207._0_8_ = 0x42b0c0a542b0c0a5;
                      auVar207._12_4_ = 0x42b0c0a5;
                      auVar116 = vfmadd231ps_fma(auVar205,auVar190,auVar94);
                      auVar179._8_4_ = 0x3f000000;
                      auVar179._0_8_ = 0x3f0000003f000000;
                      auVar179._12_4_ = 0x3f000000;
                      auVar127 = vfmsub231ps_fma(auVar116,auVar179,auVar194);
                      auVar116 = vcmpps_avx(auVar198,(undefined1  [16])0x0,2);
                      auVar127 = vsubps_avx(auVar127,auVar140);
                      auVar190 = vfnmadd231ps_fma(auVar127,auVar81,auVar190);
                      auVar141._0_4_ = auVar190._0_4_ + auVar190._0_4_;
                      auVar141._4_4_ = auVar190._4_4_ + auVar190._4_4_;
                      auVar141._8_4_ = auVar190._8_4_ + auVar190._8_4_;
                      auVar141._12_4_ = auVar190._12_4_ + auVar190._12_4_;
                      auVar160._8_4_ = 0x7fffffff;
                      auVar160._0_8_ = 0x7fffffff7fffffff;
                      auVar160._12_4_ = 0x7fffffff;
                      auVar116 = vblendvps_avx(auVar141,auVar160,auVar116);
                      auVar116 = vminps_avx(auVar207,auVar116);
                      auVar127 = vmaxps_avx(auVar209,auVar116);
                      auVar161._8_4_ = 0x3f000000;
                      auVar161._0_8_ = 0x3f0000003f000000;
                      auVar161._12_4_ = 0x3f000000;
                      auVar116 = vfmadd213ps_fma(auVar197,auVar127,auVar161);
                      auVar162._0_4_ = (int)auVar116._0_4_;
                      auVar162._4_4_ = (int)auVar116._4_4_;
                      auVar162._8_4_ = (int)auVar116._8_4_;
                      auVar162._12_4_ = (int)auVar116._12_4_;
                      auVar190 = vcvtdq2ps_avx(auVar162);
                      auVar116 = vcmpps_avx(auVar116,auVar190,1);
                      auVar116 = vandps_avx(auVar53,auVar116);
                      auVar116 = vsubps_avx(auVar190,auVar116);
                      auVar190 = vfmsub231ps_fma(auVar127,auVar116,auVar81);
                      auVar127 = vfnmsub231ps_fma(auVar190,auVar116,auVar94);
                      auVar95._8_4_ = 0x3f000000;
                      auVar95._0_8_ = 0x3f0000003f000000;
                      auVar95._12_4_ = 0x3f000000;
                      auVar99 = ZEXT1664(auVar95);
                      auVar163._0_4_ = auVar127._0_4_ * auVar127._0_4_;
                      auVar163._4_4_ = auVar127._4_4_ * auVar127._4_4_;
                      auVar163._8_4_ = auVar127._8_4_ * auVar127._8_4_;
                      auVar163._12_4_ = auVar127._12_4_ * auVar127._12_4_;
                      auVar195._8_4_ = 0x39506967;
                      auVar195._0_8_ = 0x3950696739506967;
                      auVar195._12_4_ = 0x39506967;
                      auVar180 = ZEXT1664(CONCAT412(0x80000000,
                                                    CONCAT48(0x80000000,0x8000000080000000)));
                      auVar82._8_4_ = 0x3ab743ce;
                      auVar82._0_8_ = 0x3ab743ce3ab743ce;
                      auVar82._12_4_ = 0x3ab743ce;
                      auVar190 = vfmadd213ps_fma(auVar195,auVar127,auVar82);
                      auVar190 = vfmadd213ps_fma(auVar190,auVar127,auVar184);
                      auVar83._8_4_ = 0x3d2aa9c1;
                      auVar83._0_8_ = 0x3d2aa9c13d2aa9c1;
                      auVar83._12_4_ = 0x3d2aa9c1;
                      auVar190 = vfmadd213ps_fma(auVar190,auVar127,auVar83);
                      auVar84._8_4_ = 0x3e2aaaaa;
                      auVar84._0_8_ = 0x3e2aaaaa3e2aaaaa;
                      auVar84._12_4_ = 0x3e2aaaaa;
                      auVar190 = vfmadd213ps_fma(auVar190,auVar127,auVar84);
                      auVar190 = vfmadd213ps_fma(auVar190,auVar127,auVar95);
                      auVar190 = vfmadd213ps_fma(auVar190,auVar163,auVar127);
                      auVar122._0_4_ = auVar190._0_4_ + 1.0;
                      auVar122._4_4_ = auVar190._4_4_ + 1.0;
                      auVar122._8_4_ = auVar190._8_4_ + 1.0;
                      auVar122._12_4_ = auVar190._12_4_ + 1.0;
                      auVar142._0_4_ = (int)auVar116._0_4_;
                      auVar142._4_4_ = (int)auVar116._4_4_;
                      auVar142._8_4_ = (int)auVar116._8_4_;
                      auVar142._12_4_ = (int)auVar116._12_4_;
                      auVar116 = vpslld_avx(auVar142,0x17);
                      auVar116 = vpaddd_avx(auVar53,auVar116);
                      auVar190 = vfmadd213ps_fma(auVar116,auVar122,auVar53);
                      auVar116 = vrcpps_avx(auVar190);
                      auVar164._0_4_ = auVar116._0_4_ + auVar116._0_4_;
                      auVar164._4_4_ = auVar116._4_4_ + auVar116._4_4_;
                      auVar164._8_4_ = auVar116._8_4_ + auVar116._8_4_;
                      auVar164._12_4_ = auVar116._12_4_ + auVar116._12_4_;
                      auVar85._8_4_ = 0x40000000;
                      auVar85._0_8_ = 0x4000000040000000;
                      auVar85._12_4_ = 0x40000000;
                      auVar190 = vfmsub213ps_fma(auVar190,auVar164,auVar85);
                      auVar116 = vfnmadd213ps_fma(auVar190,auVar116,auVar164);
                      auVar108 = vfmsub231ps_fma(auVar108,auVar108,auVar116);
                      break;
                    case 5:
                      uVar3 = **(undefined4 **)(&this->field_0x118 + (long)p_Var43);
                      auVar126._4_4_ = uVar3;
                      auVar126._0_4_ = uVar3;
                      auVar126._8_4_ = uVar3;
                      auVar126._12_4_ = uVar3;
                      uVar3 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var43))[1];
                      auVar148._4_4_ = uVar3;
                      auVar148._0_4_ = uVar3;
                      auVar148._8_4_ = uVar3;
                      auVar148._12_4_ = uVar3;
                      auVar116 = vfmadd231ps_fma(auVar148,auVar108,auVar126);
                      auVar116 = vmaxps_avx(auVar116,(undefined1  [16])0x0);
                      auVar116 = vminps_avx(auVar53,auVar116);
                      auVar108._0_4_ = auVar116._0_4_ * auVar108._0_4_;
                      auVar108._4_4_ = auVar116._4_4_ * fVar44;
                      auVar108._8_4_ = auVar116._8_4_ * fVar54;
                      auVar108._12_4_ = auVar116._12_4_ * fVar1;
                    }
                    if (iVar48 < 0x65) {
                      *pauVar49 = auVar101;
                      pauVar49[1] = auVar108;
                      pauVar49 = pauVar49 + 2;
                    }
                    else {
                      pfVar37 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var43) +
                                         local_298 * 0x20);
                      auVar105._0_4_ = auVar101._0_4_ * *pfVar37;
                      auVar105._4_4_ = auVar101._4_4_ * pfVar37[1];
                      auVar105._8_4_ = auVar101._8_4_ * pfVar37[2];
                      auVar105._12_4_ = auVar101._12_4_ * pfVar37[3];
                      pfVar37 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var43) + 0x10 +
                                         local_298 * 0x20);
                      auVar112._0_4_ = auVar108._0_4_ * *pfVar37;
                      auVar112._4_4_ = auVar108._4_4_ * pfVar37[1];
                      auVar112._8_4_ = auVar108._8_4_ * pfVar37[2];
                      auVar112._12_4_ = auVar108._12_4_ * pfVar37[3];
                      auVar116 = vandps_avx(auVar180._0_16_,auVar105);
                      auVar190 = vandps_avx(auVar180._0_16_,auVar112);
                      auVar116 = vorps_avx(auVar116,auVar99._0_16_);
                      auVar190 = vorps_avx(auVar190,auVar99._0_16_);
                      auVar106._0_4_ = (int)(auVar105._0_4_ + auVar116._0_4_);
                      auVar106._4_4_ = (int)(auVar105._4_4_ + auVar116._4_4_);
                      auVar106._8_4_ = (int)(auVar105._8_4_ + auVar116._8_4_);
                      auVar106._12_4_ = (int)(auVar105._12_4_ + auVar116._12_4_);
                      auVar113._0_4_ = (int)(auVar112._0_4_ + auVar190._0_4_);
                      auVar113._4_4_ = (int)(auVar112._4_4_ + auVar190._4_4_);
                      auVar113._8_4_ = (int)(auVar112._8_4_ + auVar190._8_4_);
                      auVar113._12_4_ = (int)(auVar112._12_4_ + auVar190._12_4_);
                      auVar116 = vpackssdw_avx(auVar106,auVar113);
                      auVar116 = vpminsw_avx(auVar116,_DAT_0059eae0);
                      auVar116 = vpmaxsw_avx(auVar116,_DAT_0059eaf0);
                      auVar116 = vpacksswb_avx(auVar116,auVar116);
                      *(long *)*pauVar50 = auVar116._0_8_;
                      pauVar50 = (undefined1 (*) [16])((long)*pauVar50 + 8);
                    }
                    bVar52 = iVar41 != iVar36;
                    iVar41 = iVar41 + 1;
                  } while (bVar52);
                }
                uVar40 = (int)local_2b0 + 1;
                bVar52 = (int)local_2b0 != (int)local_1d8;
                local_2b0 = (ulong)uVar40;
              } while (bVar52);
            }
            local_298 = local_298 + 1;
            local_290 = (ulong)(uint)((int)local_290 + iVar47);
            local_1e0 = uVar39;
          } while (local_298 != uVar39);
        }
        if ((pointer)local_308._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_308._0_8_,local_308._16_8_ - local_308._0_8_);
        }
        iVar42 = 0;
        local_308._8_8_ = (Allocator *)CONCAT44(local_308._12_4_,local_308._8_4_);
      }
      goto LAB_0040d647;
    }
    p_Var43 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
    iVar47 = *(int *)(&this->field_0xd4 + (long)p_Var43);
    if ((long)iVar47 == 3) {
      if (((((*(int *)(&this->field_0xd8 + (long)p_Var43) == 3) &&
            (*(int *)(&this->field_0xe4 + (long)p_Var43) == 1)) &&
           (*(int *)(&this->field_0xe8 + (long)p_Var43) == 1)) &&
          ((*(int *)(&this->field_0xdc + (long)p_Var43) == 1 &&
           (*(int *)(&this->field_0xe0 + (long)p_Var43) == 1)))) &&
         (*(uint *)(&this->field_0x110 + (long)p_Var43) < 2)) {
        if (iVar48 < 0x65) {
          local_308._0_8_ = (pointer)0x0;
          local_308._8_8_ = (Allocator *)0x0;
          local_308._16_8_ = (Allocator *)0x0;
          p_Var43 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
          if (0 < *(int *)(&this->field_0x108 + (long)p_Var43)) {
            lVar34 = 0;
            local_308._8_8_ = (float *)0x0;
            do {
              local_238._0_4_ =
                   1.0 / (*(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var43) + lVar34 * 4) *
                         *(float *)(*(long *)(&this->field_0x240 + (long)p_Var43) + lVar34 * 4));
              if (local_308._8_8_ == local_308._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_308,
                           (iterator)local_308._8_8_,(float *)local_238);
              }
              else {
                *(undefined4 *)local_308._8_8_ = local_238._0_4_;
                local_308._8_8_ = local_308._8_8_ + 4;
              }
              lVar34 = lVar34 + 1;
              p_Var43 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
            } while (lVar34 < *(int *)(&this->field_0x108 + (long)p_Var43));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_a8,(vector<float,_std::allocator<float>_> *)local_308);
          convdw3x3s1_int8_dequant_sse
                    (&local_288,top_blob,&this->weight_data_tm,
                     (Mat *)(&this->field_0x1b0 + (long)p_Var43),&local_a8,opt_00);
        }
        else {
          local_308._0_8_ = (pointer)0x0;
          local_308._8_8_ = (Allocator *)0x0;
          local_308._16_8_ = (Allocator *)0x0;
          p_Var43 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
          if (0 < *(int *)(&this->field_0x108 + (long)p_Var43)) {
            lVar34 = 0;
            local_308._8_8_ = (float *)0x0;
            do {
              fVar44 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var43) + lVar34 * 4);
              local_238._0_4_ = 0.0;
              if (fVar44 != 0.0) {
                local_238._0_4_ =
                     1.0 / (fVar44 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var43) +
                                               lVar34 * 4));
              }
              local_178._0_4_ =
                   *(float *)(*(long *)(&this->field_0x288 + (long)p_Var43) + lVar34 * 4);
              if (local_308._8_8_ == local_308._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_308,
                           (iterator)local_308._8_8_,(float *)local_238);
              }
              else {
                *(undefined4 *)local_308._8_8_ = local_238._0_4_;
                local_308._8_8_ = local_308._8_8_ + 4;
              }
              if (local_308._8_8_ == local_308._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_308,
                           (iterator)local_308._8_8_,(float *)&local_178);
              }
              else {
                *(float *)local_308._8_8_ = (float)local_178;
                local_308._8_8_ = local_308._8_8_ + 4;
              }
              lVar34 = lVar34 + 1;
              p_Var43 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
            } while (lVar34 < *(int *)(&this->field_0x108 + (long)p_Var43));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_90,(vector<float,_std::allocator<float>_> *)local_308);
          convdw3x3s1_int8_requant_sse
                    (&local_288,top_blob,&this->weight_data_tm,
                     (Mat *)(&this->field_0x1b0 + (long)p_Var43),&local_90,opt_00);
          local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
          local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage =
               local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
        }
        if (local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((pointer)local_308._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_308._0_8_,local_308._16_8_ - local_308._0_8_);
        }
        pLVar8 = this->activation;
      }
      else {
        if ((((iVar47 != 3) || (*(int *)(&this->field_0xd8 + (long)p_Var43) != 3)) ||
            ((*(int *)(&this->field_0xdc + (long)p_Var43) != 1 ||
             (((*(int *)(&this->field_0xe0 + (long)p_Var43) != 1 ||
               (*(int *)(&this->field_0xe4 + (long)p_Var43) != 2)) ||
              (*(int *)(&this->field_0xe8 + (long)p_Var43) != 2)))))) ||
           (1 < *(uint *)(&this->field_0x110 + (long)p_Var43))) goto LAB_0040cfda;
        if (iVar48 < 0x65) {
          local_308._0_8_ = (pointer)0x0;
          local_308._8_8_ = (Allocator *)0x0;
          local_308._16_8_ = (Allocator *)0x0;
          p_Var43 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
          if (0 < *(int *)(&this->field_0x108 + (long)p_Var43)) {
            lVar34 = 0;
            local_308._8_8_ = (float *)0x0;
            do {
              local_238._0_4_ =
                   1.0 / (*(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var43) + lVar34 * 4) *
                         *(float *)(*(long *)(&this->field_0x240 + (long)p_Var43) + lVar34 * 4));
              if (local_308._8_8_ == local_308._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_308,
                           (iterator)local_308._8_8_,(float *)local_238);
              }
              else {
                *(undefined4 *)local_308._8_8_ = local_238._0_4_;
                local_308._8_8_ = local_308._8_8_ + 4;
              }
              lVar34 = lVar34 + 1;
              p_Var43 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
            } while (lVar34 < *(int *)(&this->field_0x108 + (long)p_Var43));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_d8,(vector<float,_std::allocator<float>_> *)local_308);
          convdw3x3s2_int8_dequant_sse
                    (&local_288,top_blob,&this->weight_data_tm,
                     (Mat *)(&this->field_0x1b0 + (long)p_Var43),&local_d8,opt_00);
        }
        else {
          local_308._0_8_ = (pointer)0x0;
          local_308._8_8_ = (Allocator *)0x0;
          local_308._16_8_ = (Allocator *)0x0;
          p_Var43 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
          if (0 < *(int *)(&this->field_0x108 + (long)p_Var43)) {
            lVar34 = 0;
            local_308._8_8_ = (float *)0x0;
            do {
              fVar44 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var43) + lVar34 * 4);
              local_238._0_4_ = 0.0;
              if (fVar44 != 0.0) {
                local_238._0_4_ =
                     1.0 / (fVar44 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var43) +
                                               lVar34 * 4));
              }
              local_178._0_4_ =
                   *(float *)(*(long *)(&this->field_0x288 + (long)p_Var43) + lVar34 * 4);
              if (local_308._8_8_ == local_308._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_308,
                           (iterator)local_308._8_8_,(float *)local_238);
              }
              else {
                *(undefined4 *)local_308._8_8_ = local_238._0_4_;
                local_308._8_8_ = local_308._8_8_ + 4;
              }
              if (local_308._8_8_ == local_308._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_308,
                           (iterator)local_308._8_8_,(float *)&local_178);
              }
              else {
                *(float *)local_308._8_8_ = (float)local_178;
                local_308._8_8_ = local_308._8_8_ + 4;
              }
              lVar34 = lVar34 + 1;
              p_Var43 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
            } while (lVar34 < *(int *)(&this->field_0x108 + (long)p_Var43));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_c0,(vector<float,_std::allocator<float>_> *)local_308);
          convdw3x3s2_int8_requant_sse
                    (&local_288,top_blob,&this->weight_data_tm,
                     (Mat *)(&this->field_0x1b0 + (long)p_Var43),&local_c0,opt_00);
          local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
          local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage =
               local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
        }
        if (local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((pointer)local_308._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_308._0_8_,local_308._16_8_ - local_308._0_8_);
        }
        pLVar8 = this->activation;
      }
      if (pLVar8 != (Layer *)0x0) {
        (*pLVar8->_vptr_Layer[9])(pLVar8,top_blob,opt);
        iVar42 = 0;
        goto LAB_0040d647;
      }
    }
    else {
LAB_0040cfda:
      local_298 = (long)*(int *)(&this->field_0xd8 + (long)p_Var43) * (long)iVar47;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_308,local_298,
                 (allocator_type *)local_238);
      uVar17 = local_308._0_8_;
      pp_Var5 = this->_vptr_ConvolutionDepthWise_x86_fma;
      p_Var43 = pp_Var5[-3];
      if (0 < *(int *)(&this->field_0xd8 + (long)p_Var43)) {
        iVar47 = *(int *)(&this->field_0xe0 + (long)p_Var43);
        iVar41 = *(int *)(&this->field_0xdc + (long)p_Var43);
        iVar35 = *(int *)(&this->field_0xd4 + (long)p_Var43);
        iVar31 = 0;
        fVar44 = 0.0;
        iVar42 = 0;
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var5[-3])) {
            lVar34 = 0;
            do {
              *(float *)(local_308._0_8_ + (iVar42 + lVar34) * 4) = fVar44;
              fVar44 = (float)((int)fVar44 + *(int *)(&this->field_0xdc + (long)pp_Var5[-3]));
              lVar34 = lVar34 + 1;
            } while ((int)lVar34 < *(int *)(&this->field_0xd4 + (long)pp_Var5[-3]));
            iVar42 = iVar42 + (int)lVar34;
          }
          fVar44 = (float)((int)fVar44 + (iVar27 * iVar47 - iVar41 * iVar35));
          iVar31 = iVar31 + 1;
        } while (iVar31 < *(int *)(&this->field_0xd8 + (long)pp_Var5[-3]));
      }
      local_1d0 = this->_vptr_ConvolutionDepthWise_x86_fma;
      if (0 < *(int *)(&this->field_0x108 + (long)local_1d0[-3])) {
        local_e0 = (long)(int)local_298;
        uVar39 = local_298 & 0xffffffff;
        local_1e8 = 0;
        auVar99 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
        lVar34 = 0;
        uVar38 = local_298;
        do {
          lVar28 = local_1e8;
          pvVar6 = local_288.data;
          if (-1 < (int)local_1d8) {
            lVar46 = local_288.cstep * lVar34 * local_288.elemsize;
            local_2b8 = (float *)(top_blob->elemsize * lVar34 * top_blob->cstep +
                                 (long)top_blob->data);
            local_2a0 = this->_vptr_ConvolutionDepthWise_x86_fma;
            uVar51 = (long)local_288.w * local_288.elemsize;
            pvVar7 = (this->weight_data_tm).data;
            local_1e0 = 0;
            local_2a8 = local_2b8;
            local_290 = uVar51;
            do {
              if (-1 < iVar36) {
                local_2b0 = (ulong)(int)local_1e0;
                iVar47 = 0;
                do {
                  p_Var43 = local_2a0[-3];
                  fVar44 = 0.0;
                  fVar54 = 0.0;
                  if (0 < (int)uVar38) {
                    uVar33 = 0;
                    iVar41 = 0;
                    do {
                      iVar41 = iVar41 + (int)*(char *)((long)pvVar7 + uVar33 + lVar28) *
                                        (int)*(char *)((long)pvVar6 +
                                                      (long)(int)*(pointer)(uVar17 + uVar33 * 4) +
                                                      (long)*(int *)(&this->field_0xe8 +
                                                                    (long)p_Var43) * local_2b0 *
                                                      uVar51 + (long)iVar47 *
                                                               (long)*(int *)(&this->field_0xe4 +
                                                                             (long)p_Var43) + lVar46
                                                      );
                      uVar33 = uVar33 + 1;
                    } while (uVar39 != uVar33);
                    fVar54 = (float)iVar41;
                  }
                  fVar1 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var43) + lVar34 * 4);
                  if (fVar1 != 0.0) {
                    fVar44 = 1.0 / (fVar1 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var43)
                                                      + lVar34 * 4));
                  }
                  fVar44 = fVar44 * fVar54;
                  if (*(int *)(&this->field_0x100 + (long)p_Var43) != 0) {
                    fVar44 = fVar44 + *(float *)(*(long *)(&this->field_0x1b0 + (long)p_Var43) +
                                                lVar34 * 4);
                  }
                  auVar53 = ZEXT416((uint)fVar44);
                  fVar54 = fVar44;
                  switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var43)) {
                  case 1:
                    auVar53 = vmaxss_avx(auVar53,ZEXT416(0));
                    fVar54 = auVar53._0_4_;
                    break;
                  case 2:
                    auVar53 = vcmpss_avx(ZEXT816(0) << 0x40,auVar53,1);
                    auVar97._8_4_ = 0x3f800000;
                    auVar97._0_8_ = 0x3f8000003f800000;
                    auVar97._12_4_ = 0x3f800000;
                    auVar53 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var43))
                                            ,auVar97,auVar53);
                    fVar54 = auVar53._0_4_ * fVar44;
                    break;
                  case 3:
                    fVar44 = (float)(*(uint **)(&this->field_0x118 + (long)p_Var43))[1];
                    auVar53 = vmaxss_avx(auVar53,ZEXT416(**(uint **)(&this->field_0x118 +
                                                                    (long)p_Var43)));
                    fVar54 = auVar53._0_4_;
                    if (fVar44 < auVar53._0_4_) {
                      fVar54 = fVar44;
                    }
                    break;
                  case 4:
                    auVar53 = vminss_avx(auVar53,ZEXT416(0x42b0c0a5));
                    auVar91._0_4_ = auVar53._0_4_ ^ auVar99._0_4_;
                    auVar91._4_4_ = auVar53._4_4_ ^ auVar99._4_4_;
                    auVar91._8_4_ = auVar53._8_4_ ^ auVar99._8_4_;
                    auVar91._12_4_ = auVar53._12_4_ ^ auVar99._12_4_;
                    auVar53 = vcmpss_avx(auVar53,ZEXT416(0xc2b0c0a5),1);
                    auVar96._8_4_ = 0x42b0c0a5;
                    auVar96._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar96._12_4_ = 0x42b0c0a5;
                    auVar53 = vblendvps_avx(auVar91,auVar96,auVar53);
                    fVar44 = expf(auVar53._0_4_);
                    auVar99 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000))
                                      );
                    uVar38 = local_298;
                    uVar51 = local_290;
                    fVar54 = 1.0 / (fVar44 + 1.0);
                    break;
                  case 5:
                    fVar54 = expf(fVar44);
                    fVar54 = logf(fVar54 + 1.0);
                    fVar54 = tanhf(fVar54);
                    auVar99 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000))
                                      );
                    uVar38 = local_298;
                    uVar51 = local_290;
                    fVar54 = fVar54 * fVar44;
                    break;
                  case 6:
                    fVar1 = **(float **)(&this->field_0x118 + (long)p_Var43);
                    fVar2 = (*(float **)(&this->field_0x118 + (long)p_Var43))[1];
                    fVar100 = (float)((uint)fVar2 ^ auVar99._0_4_) / fVar1;
                    fVar54 = 0.0;
                    if ((fVar100 <= fVar44) && (fVar54 = fVar44, fVar44 <= fVar100 + 1.0 / fVar1)) {
                      auVar53 = vfmadd213ss_fma(ZEXT416((uint)fVar1),auVar53,ZEXT416((uint)fVar2));
                      fVar54 = auVar53._0_4_ * fVar44;
                    }
                  }
                  if (iVar48 < 0x65) {
                    *local_2b8 = fVar54;
                    local_2b8 = local_2b8 + 1;
                  }
                  else {
                    fVar54 = fVar54 * *(float *)(*(long *)(&this->field_0x288 + (long)p_Var43) +
                                                lVar34 * 4);
                    auVar53 = vandps_avx(ZEXT416((uint)fVar54),auVar99._0_16_);
                    auVar98._8_4_ = 0x3effffff;
                    auVar98._0_8_ = 0x3effffff3effffff;
                    auVar98._12_4_ = 0x3effffff;
                    auVar53 = vorps_avx(auVar53,auVar98);
                    auVar53 = ZEXT416((uint)(fVar54 + auVar53._0_4_));
                    auVar53 = vroundss_avx(auVar53,auVar53,0xb);
                    iVar41 = (int)auVar53._0_4_;
                    if (iVar41 < -0x7e) {
                      iVar41 = -0x7f;
                    }
                    uVar29 = (undefined1)iVar41;
                    if (0x7e < iVar41) {
                      uVar29 = 0x7f;
                    }
                    *(undefined1 *)local_2a8 = uVar29;
                    local_2a8 = (float *)((long)local_2a8 + 1);
                  }
                  bVar52 = iVar47 != iVar36;
                  iVar47 = iVar47 + 1;
                } while (bVar52);
              }
              iVar47 = (int)local_1e0;
              local_1e0 = (ulong)(iVar47 + 1);
            } while (iVar47 != (int)local_1d8);
          }
          lVar34 = lVar34 + 1;
          local_1e8 = local_1e8 + local_e0;
        } while (lVar34 < *(int *)(&this->field_0x108 + (long)local_1d0[-3]));
      }
      if ((pointer)local_308._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_308._0_8_,local_308._16_8_ - local_308._0_8_);
      }
    }
    iVar42 = 0;
    goto LAB_0040d647;
  }
  iVar36 = *(int *)(&this->field_0x10c + (long)p_Var43);
  local_2a8 = (float *)0x1;
  if (opt->use_packing_layout == true) {
    if (iVar36 < 0x65) {
      local_2a8 = (float *)(ulong)((uint)((*(uint *)(&this->field_0xd0 + (long)p_Var43) & 3) == 0) *
                                   3 + 1);
    }
    else {
      local_2a8 = (float *)0x1;
      if ((*(uint *)(&this->field_0xd0 + (long)p_Var43) & 7) == 0) {
        local_2a8 = (float *)&DAT_00000008;
      }
    }
  }
  iVar48 = (int)local_2a8;
  pfVar37 = (float *)(ulong)(uint)(iVar48 * 4);
  if (100 < iVar36) {
    pfVar37 = local_2a8;
  }
  local_2a0 = (_func_int **)CONCAT44(local_2a0._4_4_,iVar41);
  local_2b0 = CONCAT44(local_2b0._4_4_,iVar47);
  Mat::create(top_blob,iVar41,iVar47,*(int *)(&this->field_0xd0 + (long)p_Var43) / iVar48,
              (size_t)pfVar37,iVar48,opt->blob_allocator);
  auVar26 = local_2e8;
  iVar42 = -100;
  local_308._8_8_ = (Allocator *)CONCAT44(local_308._12_4_,local_308._8_4_);
  if ((top_blob->data == (void *)0x0) ||
     (local_308._8_8_ = (Allocator *)CONCAT44(local_308._12_4_,local_308._8_4_),
     (long)top_blob->c * top_blob->cstep == 0)) goto LAB_0040d647;
  uVar40 = (int)uVar40 /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]);
  uVar30 = *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]) /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]);
  local_2b8 = (float *)CONCAT44(local_2b8._4_4_,uVar30);
  iVar47 = 1;
  _elempack = 1;
  if (opt->use_packing_layout == true) {
    iVar47 = 1;
    if ((uVar40 & 7) == 0) {
      iVar47 = 8;
    }
    if (iVar36 < 0x65) {
      _elempack = (uint)((uVar30 & 3) == 0) * 3 + 1;
    }
    else {
      _elempack = 1;
      if ((uVar30 & 7) == 0) {
        _elempack = 8;
      }
    }
  }
  piVar4 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
  local_308._0_8_ = local_288.data;
  local_308._8_4_ = local_288.refcount._0_4_;
  local_308._12_4_ = local_288.refcount._4_4_;
  local_308._16_8_ = local_288.elemsize;
  local_308._24_4_ = local_288.elempack;
  local_2e8._12_4_ = local_288.w;
  local_2e8._8_4_ = local_288.dims;
  local_2e8._20_4_ = local_288.d;
  local_2e8._16_4_ = local_288.h;
  local_2e8._0_8_ = local_288.allocator;
  local_2e8._28_4_ = auVar26._28_4_;
  local_2e8._24_4_ = local_288.c;
  local_2c8 = local_288.cstep;
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + 1;
    UNLOCK();
  }
  if (iVar47 < iVar35) {
    uVar17._0_1_ = opt->lightmode;
    uVar17._1_3_ = *(undefined3 *)&opt->field_0x1;
    uVar17._4_4_ = opt->num_threads;
    local_238._16_8_ = opt->workspace_allocator;
    uVar18 = opt->openmp_blocktime;
    uVar19 = opt->use_winograd_convolution;
    uVar21 = opt->use_sgemm_convolution;
    uVar23 = opt->use_int8_inference;
    uVar25 = opt->use_vulkan_compute;
    uVar24 = CONCAT11(uVar25,uVar23);
    uVar22 = CONCAT21(uVar24,uVar21);
    uVar20 = CONCAT31(uVar22,uVar19);
    local_238._32_8_ = *(undefined8 *)&opt->use_bf16_storage;
    auStack_210[0] = opt->use_shader_pack8;
    auStack_210[1] = opt->use_subgroup_basic;
    auStack_210[2] = opt->use_subgroup_vote;
    auStack_210[3] = opt->use_subgroup_ballot;
    auStack_210[4] = opt->use_subgroup_shuffle;
    auStack_210[5] = opt->use_image_storage;
    auStack_210[6] = opt->use_tensor_storage;
    auStack_210[7] = opt->use_reserved_0;
    auStack_210._8_4_ = opt->flush_denormals;
    auStack_210[0xc] = opt->use_local_pool_allocator;
    auStack_210[0xd] = opt->use_shader_local_memory;
    auStack_210[0xe] = opt->use_cooperative_matrix;
    auStack_210[0xf] = opt->use_winograd23_convolution;
    uStack_200._0_1_ = opt->use_winograd43_convolution;
    uStack_200._1_1_ = opt->use_winograd63_convolution;
    uStack_200._2_1_ = opt->use_a53_a55_optimized_kernel;
    uStack_200._3_1_ = opt->use_reserved_7;
    uStack_200._4_1_ = opt->use_reserved_8;
    uStack_200._5_1_ = opt->use_reserved_9;
    uStack_200._6_1_ = opt->use_reserved_10;
    uStack_200._7_1_ = opt->use_reserved_11;
    local_238._0_4_ = (undefined4)uVar17;
    local_238._8_4_ = SUB84(opt->workspace_allocator,0);
    local_238._12_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_238._4_4_ = uVar17._4_4_;
    local_238._24_4_ = uVar18;
    local_238._28_4_ = uVar20;
    convert_packing(&local_288,(Mat *)local_308,iVar47,(Option *)local_238);
  }
  piVar4 = top_blob->refcount;
  local_238._0_4_ = SUB84(top_blob->data,0);
  local_238._4_4_ = (undefined4)((ulong)top_blob->data >> 0x20);
  local_238._8_4_ = SUB84(top_blob->refcount,0);
  local_238._12_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
  local_238._16_8_ = top_blob->elemsize;
  local_238._24_4_ = top_blob->elempack;
  local_238._32_8_ = top_blob->allocator;
  auStack_210._0_4_ = top_blob->dims;
  auStack_210._4_4_ = top_blob->w;
  auStack_210._8_4_ = top_blob->h;
  auStack_210._12_4_ = top_blob->d;
  uStack_200 = CONCAT44(uStack_200._4_4_,top_blob->c);
  local_1f8 = top_blob->cstep;
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + 1;
    UNLOCK();
  }
  if (_elempack < (uint)local_2a8) {
    Mat::create((Mat *)local_238,(int)local_2a0,(int)local_2b0,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]) /
                (int)_elempack,
                (ulong)((int)((ulong)pfVar37 / ((ulong)local_2a8 & 0xffffffff)) * _elempack),
                _elempack,opt->workspace_allocator);
    iVar42 = -100;
    if ((CONCAT44(local_238._4_4_,local_238._0_4_) != 0) && ((long)(int)uStack_200 * local_1f8 != 0)
       ) goto LAB_0040ca58;
  }
  else {
LAB_0040ca58:
    if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3])) {
      local_2a0 = (_func_int **)CONCAT44(local_2a0._4_4_,(int)uVar40 / iVar47);
      iVar41 = (int)local_2b8 / (int)_elempack;
      iVar48 = 0;
      iVar36 = 0;
      lVar34 = 0;
      do {
        local_178 = (pointer)((long)(iVar48 / iVar47) * local_2c8 * local_308._16_8_ +
                             local_308._0_8_);
        uStack_170 = 0;
        uStack_16c = 0;
        local_168 = (Allocator *)local_308._16_8_;
        local_160 = local_308._24_4_;
        local_158 = (Allocator *)local_2e8._0_8_;
        local_140 = (int)local_2a0;
        local_138 = ((long)(int)local_2e8._20_4_ * local_308._16_8_ *
                     (long)(int)local_2e8._16_4_ * (long)(int)local_2e8._12_4_ + 0xfU &
                    0xfffffffffffffff0) / (ulong)local_308._16_8_;
        local_150 = local_2e8._8_16_;
        local_128 = (void *)((long)(iVar36 / (int)_elempack) * local_1f8 * local_238._16_8_ +
                            CONCAT44(local_238._4_4_,local_238._0_4_));
        uStack_120 = 0;
        uStack_11c = 0;
        local_118 = (Allocator *)local_238._16_8_;
        local_110 = local_238._24_4_;
        local_108 = (Allocator *)local_238._32_8_;
        local_e8 = ((long)(int)auStack_210._12_4_ * local_238._16_8_ *
                    (long)(int)auStack_210._8_4_ * (long)(int)auStack_210._4_4_ + 0xfU &
                   0xfffffffffffffff0) / (ulong)local_238._16_8_;
        local_100 = auStack_210;
        pLVar8 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar34];
        local_78._0_1_ = opt->lightmode;
        local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
        local_78._4_4_ = opt->num_threads;
        pAStack_68 = opt->workspace_allocator;
        uStack_60._0_4_ = opt->openmp_blocktime;
        uStack_60._4_1_ = opt->use_winograd_convolution;
        uStack_60._5_1_ = opt->use_sgemm_convolution;
        uStack_60._6_1_ = opt->use_int8_inference;
        uStack_60._7_1_ = opt->use_vulkan_compute;
        local_58._0_1_ = opt->use_bf16_storage;
        local_58._1_1_ = opt->use_fp16_packed;
        local_58._2_1_ = opt->use_fp16_storage;
        local_58._3_1_ = opt->use_fp16_arithmetic;
        local_58._4_1_ = opt->use_int8_packed;
        local_58._5_1_ = opt->use_int8_storage;
        local_58._6_1_ = opt->use_int8_arithmetic;
        local_58._7_1_ = opt->use_packing_layout;
        uStack_50._0_1_ = opt->use_shader_pack8;
        uStack_50._1_1_ = opt->use_subgroup_basic;
        uStack_50._2_1_ = opt->use_subgroup_vote;
        uStack_50._3_1_ = opt->use_subgroup_ballot;
        uStack_50._4_1_ = opt->use_subgroup_shuffle;
        uStack_50._5_1_ = opt->use_image_storage;
        uStack_50._6_1_ = opt->use_tensor_storage;
        uStack_50._7_1_ = opt->use_reserved_0;
        uStack_48._0_4_ = opt->flush_denormals;
        uStack_48._4_1_ = opt->use_local_pool_allocator;
        uStack_48._5_1_ = opt->use_shader_local_memory;
        uStack_48._6_1_ = opt->use_cooperative_matrix;
        uStack_48._7_1_ = opt->use_winograd23_convolution;
        uStack_40._0_1_ = opt->use_winograd43_convolution;
        uStack_40._1_1_ = opt->use_winograd63_convolution;
        uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
        uStack_40._3_1_ = opt->use_reserved_7;
        uStack_40._4_1_ = opt->use_reserved_8;
        uStack_40._5_1_ = opt->use_reserved_9;
        uStack_40._6_1_ = opt->use_reserved_10;
        uStack_40._7_1_ = opt->use_reserved_11;
        pAStack_70 = (Allocator *)local_238._32_8_;
        local_f0 = iVar41;
        (*pLVar8->_vptr_Layer[7])(pLVar8,&local_178,&local_128);
        piVar4 = (int *)CONCAT44(uStack_11c,uStack_120);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (local_108 == (Allocator *)0x0) {
              if (local_128 != (void *)0x0) {
                free(local_128);
              }
            }
            else {
              (*local_108->_vptr_Allocator[3])();
            }
          }
        }
        local_e8 = 0;
        local_128 = (void *)0x0;
        uStack_120 = 0;
        uStack_11c = 0;
        local_118 = (Allocator *)0x0;
        local_110 = 0;
        local_100 = (undefined1  [16])0x0;
        local_f0 = 0;
        piVar4 = (int *)CONCAT44(uStack_16c,uStack_170);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (local_158 == (Allocator *)0x0) {
              if (local_178 != (pointer)0x0) {
                free(local_178);
              }
            }
            else {
              (*local_158->_vptr_Allocator[3])();
            }
          }
        }
        local_138 = 0;
        local_178._0_4_ = 0.0;
        local_178._4_4_ = 0;
        uStack_170 = 0;
        uStack_16c = 0;
        local_168 = (Allocator *)0x0;
        local_160 = 0;
        local_150 = (undefined1  [16])0x0;
        local_140 = 0;
        lVar34 = lVar34 + 1;
        iVar36 = iVar36 + (int)local_2b8;
        iVar48 = iVar48 + uVar40;
      } while (lVar34 < *(int *)(&this->field_0x108 +
                                (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]));
    }
    if (_elempack < (uint)local_2a8) {
      convert_packing((Mat *)local_238,top_blob,(uint)local_2a8,opt);
      iVar42 = 0;
    }
    else {
      iVar42 = 0;
      if ((Mat *)local_238 != top_blob) {
        piVar4 = (int *)CONCAT44(local_238._12_4_,local_238._8_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = top_blob->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        auVar53 = auStack_210;
        iVar42 = 0;
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        top_blob->data = (void *)CONCAT44(local_238._4_4_,local_238._0_4_);
        top_blob->refcount = (int *)CONCAT44(local_238._12_4_,local_238._8_4_);
        top_blob->elemsize = local_238._16_8_;
        top_blob->elempack = local_238._24_4_;
        top_blob->allocator = (Allocator *)local_238._32_8_;
        top_blob->dims = auStack_210._0_4_;
        top_blob->w = auStack_210._4_4_;
        top_blob->h = auStack_210._8_4_;
        top_blob->d = auStack_210._12_4_;
        top_blob->c = (int)uStack_200;
        top_blob->cstep = local_1f8;
        auStack_210 = auVar53;
      }
    }
  }
  piVar4 = (int *)CONCAT44(local_238._12_4_,local_238._8_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if ((Allocator *)local_238._32_8_ == (Allocator *)0x0) {
        if ((void *)CONCAT44(local_238._4_4_,local_238._0_4_) != (void *)0x0) {
          free((void *)CONCAT44(local_238._4_4_,local_238._0_4_));
        }
      }
      else {
        (*(*(_func_int ***)local_238._32_8_)[3])();
      }
    }
  }
  local_1f8 = 0;
  local_238._0_4_ = 0.0;
  local_238._4_4_ = 0;
  local_238._8_4_ = 0;
  local_238._12_4_ = 0;
  local_238._16_8_ = (Allocator *)0x0;
  local_238._24_4_ = 0;
  auStack_210 = (undefined1  [16])0x0;
  uStack_200 = uStack_200 & 0xffffffff00000000;
  piVar4 = (int *)CONCAT44(local_308._12_4_,local_308._8_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if ((Allocator *)local_2e8._0_8_ == (Allocator *)0x0) {
        if ((pointer)local_308._0_8_ != (pointer)0x0) {
          free((void *)local_308._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_2e8._0_8_)[3])();
      }
    }
  }
  local_2c8 = 0;
  local_308._0_8_ = (pointer)0x0;
  local_308._8_8_ = (Allocator *)0x0;
  local_308._16_8_ = (Allocator *)0x0;
  local_308._24_4_ = 0;
  local_2e8._0_28_ = ZEXT828((ulong)local_2e8._0_8_);
LAB_0040d647:
  piVar4 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_288.allocator == (Allocator *)0x0) {
        if ((pointer)local_288.data != (pointer)0x0) {
          free(local_288.data);
        }
      }
      else {
        (*(local_288.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_288.cstep = 0;
  local_288.data = (void *)0x0;
  local_288.refcount._0_4_ = 0;
  local_288.refcount._4_4_ = 0;
  local_288.elemsize = 0;
  local_288.elempack = 0;
  local_288.dims = 0;
  local_288.w = 0;
  local_288.h = 0;
  local_288.d = 0;
  local_288.c = 0;
  piVar4 = (int *)CONCAT44(local_1c8._12_4_,local_1c8._8_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if ((Allocator *)local_1c8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_1c8._0_8_ != (void *)0x0) {
          free((void *)local_1c8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_1c8._32_8_)[3])();
      }
    }
  }
  return iVar42;
}

Assistant:

int ConvolutionDepthWise_x86_fma::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        if (use_int8_requantize)
            out_g_elempack = num_output_g % 8 == 0 ? 8 : 1;
        else
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}